

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  int i_2;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int i;
  bool bVar24;
  bool bVar25;
  float fVar26;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar65;
  Vec3fa n1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  Vec3fa n0;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar110;
  float fVar114;
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar125;
  uint uVar138;
  uint uVar139;
  vfloat4 a;
  undefined1 auVar126 [16];
  uint uVar140;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint uVar141;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar161;
  float fVar165;
  vfloat4 a_1;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar197;
  float fVar198;
  float fVar205;
  float fVar207;
  Vec3ff v3;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar211;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  size_t local_e0;
  size_t local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  
  auVar87 = _DAT_01feb9f0;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = _DAT_01feb9f0;
  auVar102 = _DAT_01feba00;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = _DAT_01feba00;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar87;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar102;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar20 = r->_begin;
  local_e0 = __return_storage_ptr__->end;
  if (uVar20 < r->_end) {
    local_b8 = auVar87;
    local_a8 = auVar102;
    local_c8 = k;
    do {
      uVar12 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar20);
      uVar16 = (ulong)uVar12;
      uVar21 = (ulong)(uVar12 + 3);
      pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar21 < (pBVar6->super_RawBufferView).num) {
        uVar13 = (ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar22 = uVar12 + 2;
        pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        fVar154 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  maxRadiusScale;
        bVar24 = false;
        uVar15 = 0;
        do {
          pcVar8 = pBVar6[uVar15].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar6[uVar15].super_RawBufferView.stride;
          lVar18 = sVar9 * uVar16;
          lVar19 = sVar9 * (uVar12 + 1);
          lVar14 = sVar9 * uVar22;
          auVar126._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar19 + 0xc)));
          auVar126._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar18 + 0xc)));
          auVar126._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar14 + 0xc)));
          auVar126._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar21 + 0xc)));
          iVar23 = movmskps(uVar22,auVar126);
          if (iVar23 != 0) {
LAB_00a69ed8:
            if (!bVar24) goto LAB_00a6ae68;
            break;
          }
          auVar126 = *(undefined1 (*) [16])(pcVar8 + lVar18);
          fVar26 = auVar126._0_4_;
          fVar66 = auVar126._4_4_;
          fVar67 = auVar126._8_4_;
          fVar68 = auVar126._12_4_;
          auVar173._0_4_ = -(uint)(fVar26 < 1.844e+18 && -1.844e+18 < fVar26);
          auVar173._4_4_ = -(uint)(fVar66 < 1.844e+18 && -1.844e+18 < fVar66);
          auVar173._8_4_ = -(uint)(fVar67 < 1.844e+18 && -1.844e+18 < fVar67);
          auVar173._12_4_ = -(uint)(fVar68 < 1.844e+18 && -1.844e+18 < fVar68);
          uVar17 = movmskps((int)lVar18,auVar173);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          auVar126 = *(undefined1 (*) [16])(pcVar8 + lVar19);
          fVar103 = auVar126._0_4_;
          fVar111 = auVar126._4_4_;
          fVar112 = auVar126._8_4_;
          fVar113 = auVar126._12_4_;
          auVar69._0_4_ = -(uint)(fVar103 < 1.844e+18 && -1.844e+18 < fVar103);
          auVar69._4_4_ = -(uint)(fVar111 < 1.844e+18 && -1.844e+18 < fVar111);
          auVar69._8_4_ = -(uint)(fVar112 < 1.844e+18 && -1.844e+18 < fVar112);
          auVar69._12_4_ = -(uint)(fVar113 < 1.844e+18 && -1.844e+18 < fVar113);
          uVar17 = movmskps(CONCAT31((int3)((uint)uVar17 >> 8),~(byte)uVar17),auVar69);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          auVar126 = *(undefined1 (*) [16])(pcVar8 + lVar14);
          fVar114 = auVar126._0_4_;
          fVar119 = auVar126._4_4_;
          fVar122 = auVar126._8_4_;
          fVar124 = auVar126._12_4_;
          auVar104._0_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
          auVar104._4_4_ = -(uint)(fVar119 < 1.844e+18 && -1.844e+18 < fVar119);
          auVar104._8_4_ = -(uint)(fVar122 < 1.844e+18 && -1.844e+18 < fVar122);
          auVar104._12_4_ = -(uint)(fVar124 < 1.844e+18 && -1.844e+18 < fVar124);
          uVar17 = movmskps((int)lVar14,auVar104);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          auVar126 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar21);
          fVar197 = auVar126._0_4_;
          fVar205 = auVar126._4_4_;
          fVar207 = auVar126._8_4_;
          fVar209 = auVar126._12_4_;
          auVar128._0_4_ = -(uint)(fVar197 < 1.844e+18 && -1.844e+18 < fVar197);
          auVar128._4_4_ = -(uint)(fVar205 < 1.844e+18 && -1.844e+18 < fVar205);
          auVar128._8_4_ = -(uint)(fVar207 < 1.844e+18 && -1.844e+18 < fVar207);
          auVar128._12_4_ = -(uint)(fVar209 < 1.844e+18 && -1.844e+18 < fVar209);
          uVar17 = movmskps((int)pcVar8,auVar128);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          pcVar8 = pBVar7[uVar15].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar7[uVar15].super_RawBufferView.stride;
          pfVar1 = (float *)(pcVar8 + sVar9 * uVar16);
          fVar164 = *pfVar1;
          fVar168 = pfVar1[1];
          fVar152 = pfVar1[2];
          auVar212._0_4_ = -(uint)(fVar164 < 1.844e+18 && -1.844e+18 < fVar164);
          auVar212._4_4_ = -(uint)(fVar168 < 1.844e+18 && -1.844e+18 < fVar168);
          auVar212._8_4_ = -(uint)(fVar152 < 1.844e+18 && -1.844e+18 < fVar152);
          auVar212._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
          uVar17 = movmskps((int)(sVar9 * uVar16),auVar212);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          lVar14 = sVar9 * (uVar12 + 1);
          pfVar1 = (float *)(pcVar8 + lVar14);
          fVar153 = *pfVar1;
          fVar171 = pfVar1[1];
          fVar172 = pfVar1[2];
          auVar229._0_4_ = -(uint)(fVar153 < 1.844e+18 && -1.844e+18 < fVar153);
          auVar229._4_4_ = -(uint)(fVar171 < 1.844e+18 && -1.844e+18 < fVar171);
          auVar229._8_4_ = -(uint)(fVar172 < 1.844e+18 && -1.844e+18 < fVar172);
          auVar229._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
          uVar17 = movmskps((int)lVar14,auVar229);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          fVar68 = fVar68 * fVar154;
          fVar209 = fVar209 * fVar154;
          pfVar1 = (float *)(pcVar8 + sVar9 * uVar22);
          pfVar2 = (float *)(pcVar8 + sVar9 * uVar21);
          fVar188 = *pfVar2;
          fVar228 = pfVar2[1];
          fVar234 = pfVar2[2];
          fVar226 = fVar124 * fVar154 * 0.0;
          fVar149 = fVar197 * 0.0 + fVar114 * 0.0;
          fVar161 = fVar205 * 0.0 + fVar119 * 0.0;
          fVar165 = fVar207 * 0.0 + fVar122 * 0.0;
          fVar169 = fVar209 * 0.0 + fVar226;
          fVar170 = fVar103 * 0.0;
          fVar180 = fVar111 * 0.0;
          fVar181 = fVar112 * 0.0;
          fVar182 = fVar113 * fVar154 * 0.0;
          fVar227 = fVar170 + fVar149 + fVar26;
          fVar233 = fVar180 + fVar161 + fVar66;
          fVar235 = fVar181 + fVar165 + fVar67;
          fVar236 = fVar182 + fVar169 + fVar68;
          fVar149 = (fVar103 * 3.0 + fVar149) - fVar26 * 3.0;
          fVar161 = (fVar111 * 3.0 + fVar161) - fVar66 * 3.0;
          fVar165 = (fVar112 * 3.0 + fVar165) - fVar67 * 3.0;
          fVar169 = (fVar113 * fVar154 * 3.0 + fVar169) - fVar68 * 3.0;
          fVar113 = *pfVar1 * 0.0;
          fVar120 = pfVar1[1] * 0.0;
          fVar123 = pfVar1[2] * 0.0;
          fVar103 = fVar188 * 0.0 + fVar113;
          fVar111 = fVar228 * 0.0 + fVar120;
          fVar112 = fVar234 * 0.0 + fVar123;
          fVar150 = fVar153 * 0.0;
          fVar162 = fVar171 * 0.0;
          fVar166 = fVar172 * 0.0;
          fVar151 = fVar150 + fVar103 + fVar164;
          fVar163 = fVar162 + fVar111 + fVar168;
          fVar167 = fVar166 + fVar112 + fVar152;
          fVar103 = (fVar153 * 3.0 + fVar103) - fVar164 * 3.0;
          fVar111 = (fVar171 * 3.0 + fVar111) - fVar168 * 3.0;
          fVar112 = (fVar172 * 3.0 + fVar112) - fVar152 * 3.0;
          fVar220 = fVar114 * 0.0 + fVar197 + fVar170 + fVar26 * 0.0;
          fVar224 = fVar119 * 0.0 + fVar205 + fVar180 + fVar66 * 0.0;
          fVar225 = fVar122 * 0.0 + fVar207 + fVar181 + fVar67 * 0.0;
          fVar226 = fVar226 + fVar209 + fVar182 + fVar68 * 0.0;
          fVar170 = ((fVar197 * 3.0 - fVar114 * 3.0) + fVar170) - fVar26 * 0.0;
          fVar180 = ((fVar205 * 3.0 - fVar119 * 3.0) + fVar180) - fVar66 * 0.0;
          fVar181 = ((fVar207 * 3.0 - fVar122 * 3.0) + fVar181) - fVar67 * 0.0;
          fVar182 = ((fVar209 * 3.0 - fVar124 * fVar154 * 3.0) + fVar182) - fVar68 * 0.0;
          fVar26 = fVar113 + fVar188 + fVar150 + fVar164 * 0.0;
          fVar66 = fVar120 + fVar228 + fVar162 + fVar168 * 0.0;
          fVar67 = fVar123 + fVar234 + fVar166 + fVar152 * 0.0;
          fVar68 = ((fVar188 * 3.0 - *pfVar1 * 3.0) + fVar150) - fVar164 * 0.0;
          fVar119 = ((fVar228 * 3.0 - pfVar1[1] * 3.0) + fVar162) - fVar168 * 0.0;
          fVar122 = ((fVar234 * 3.0 - pfVar1[2] * 3.0) + fVar166) - fVar152 * 0.0;
          fVar152 = fVar151 * fVar161 - fVar163 * fVar149;
          fVar164 = fVar163 * fVar165 - fVar167 * fVar161;
          fVar168 = fVar167 * fVar149 - fVar151 * fVar165;
          fVar113 = fVar161 * fVar103 - fVar111 * fVar149;
          fVar111 = fVar165 * fVar111 - fVar112 * fVar161;
          fVar112 = fVar149 * fVar112 - fVar103 * fVar165;
          fVar114 = fVar26 * fVar180 - fVar66 * fVar170;
          fVar124 = fVar66 * fVar181 - fVar67 * fVar180;
          fVar197 = fVar67 * fVar170 - fVar26 * fVar181;
          fVar26 = fVar180 * fVar68 - fVar119 * fVar170;
          fVar67 = fVar181 * fVar119 - fVar122 * fVar180;
          fVar68 = fVar170 * fVar122 - fVar68 * fVar181;
          fVar171 = fVar168 * fVar168 + fVar164 * fVar164 + fVar152 * fVar152;
          auVar173 = ZEXT416((uint)fVar171);
          auVar126 = rsqrtss(ZEXT416((uint)fVar171),auVar173);
          fVar66 = auVar126._0_4_;
          fVar153 = fVar66 * 1.5 - fVar66 * fVar66 * fVar171 * 0.5 * fVar66;
          fVar188 = fVar152 * fVar113 + fVar168 * fVar112 + fVar164 * fVar111;
          auVar126 = rcpss(auVar173,auVar173);
          fVar103 = (2.0 - fVar171 * auVar126._0_4_) * auVar126._0_4_;
          fVar207 = fVar197 * fVar197 + fVar124 * fVar124 + fVar114 * fVar114;
          auVar126 = ZEXT416((uint)fVar207);
          auVar173 = rsqrtss(ZEXT416((uint)fVar207),auVar126);
          fVar66 = auVar173._0_4_;
          fVar119 = fVar66 * 1.5 - fVar66 * fVar66 * fVar207 * 0.5 * fVar66;
          fVar172 = fVar114 * fVar26 + fVar197 * fVar68 + fVar124 * fVar67;
          auVar126 = rcpss(auVar126,auVar126);
          fVar66 = (2.0 - fVar207 * auVar126._0_4_) * auVar126._0_4_;
          fVar122 = fVar236 * fVar164 * fVar153;
          fVar209 = fVar236 * fVar168 * fVar153;
          fVar205 = fVar236 * fVar152 * fVar153;
          fVar228 = fVar227 - fVar122;
          fVar234 = fVar233 - fVar209;
          fVar120 = fVar235 - fVar205;
          fVar164 = fVar236 * fVar103 * (fVar171 * fVar111 - fVar188 * fVar164) * fVar153 +
                    fVar169 * fVar164 * fVar153;
          fVar168 = fVar236 * fVar103 * (fVar171 * fVar112 - fVar188 * fVar168) * fVar153 +
                    fVar169 * fVar168 * fVar153;
          fVar152 = fVar236 * fVar103 * (fVar171 * fVar113 - fVar188 * fVar152) * fVar153 +
                    fVar169 * fVar152 * fVar153;
          fVar103 = fVar226 * fVar124 * fVar119;
          fVar111 = fVar226 * fVar197 * fVar119;
          fVar112 = fVar226 * fVar114 * fVar119;
          fVar153 = fVar220 - fVar103;
          fVar171 = fVar224 - fVar111;
          fVar188 = fVar225 - fVar112;
          fVar113 = fVar226 * fVar66 * (fVar207 * fVar67 - fVar172 * fVar124) * fVar119 +
                    fVar182 * fVar124 * fVar119;
          fVar68 = fVar226 * fVar66 * (fVar207 * fVar68 - fVar172 * fVar197) * fVar119 +
                   fVar182 * fVar197 * fVar119;
          fVar114 = fVar226 * fVar66 * (fVar207 * fVar26 - fVar172 * fVar114) * fVar119 +
                    fVar182 * fVar114 * fVar119;
          fVar119 = (fVar149 - fVar164) * 0.33333334 + fVar228;
          fVar124 = (fVar161 - fVar168) * 0.33333334 + fVar234;
          fVar197 = (fVar165 - fVar152) * 0.33333334 + fVar120;
          fVar26 = fVar153 - (fVar170 - fVar113) * 0.33333334;
          fVar66 = fVar171 - (fVar180 - fVar68) * 0.33333334;
          fVar67 = fVar188 - (fVar181 - fVar114) * 0.33333334;
          lVar14 = 0;
          local_298._8_8_ = 0x7f8000007f800000;
          local_298._0_8_ = 0x7f8000007f800000;
          local_2a8._8_8_ = 0x7f8000007f800000;
          local_2a8._0_8_ = 0x7f8000007f800000;
          local_2b8._8_8_ = 0x7f8000007f800000;
          local_2b8._0_8_ = 0x7f8000007f800000;
          local_288 = _DAT_01feba00;
          auVar143 = _DAT_01feba00;
          auVar222 = _DAT_01feba00;
          do {
            uVar121 = (uint)lVar14;
            lVar18 = lVar14 * 4;
            fVar207 = *(float *)(bezier_basis0 + lVar18 + 0x1dc);
            fVar172 = *(float *)(bezier_basis0 + lVar18 + 0x1e0);
            fVar169 = *(float *)(bezier_basis0 + lVar18 + 0x1e4);
            fVar123 = *(float *)(bezier_basis0 + lVar18 + 0x1e8);
            lVar18 = lVar14 * 4;
            fVar150 = *(float *)(bezier_basis0 + lVar18 + 0x660);
            fVar151 = *(float *)(bezier_basis0 + lVar18 + 0x664);
            fVar162 = *(float *)(bezier_basis0 + lVar18 + 0x668);
            fVar163 = *(float *)(bezier_basis0 + lVar18 + 0x66c);
            lVar18 = lVar14 * 4;
            fVar166 = *(float *)(bezier_basis0 + lVar18 + 0xae4);
            fVar167 = *(float *)(bezier_basis0 + lVar18 + 0xae8);
            fVar182 = *(float *)(bezier_basis0 + lVar18 + 0xaec);
            fVar226 = *(float *)(bezier_basis0 + lVar18 + 0xaf0);
            lVar18 = lVar14 * 4;
            fVar236 = *(float *)(bezier_basis0 + lVar18 + 0xf68);
            fVar10 = *(float *)(bezier_basis0 + lVar18 + 0xf6c);
            fVar11 = *(float *)(bezier_basis0 + lVar18 + 0xf70);
            fVar88 = *(float *)(bezier_basis0 + lVar18 + 0xf74);
            auVar155._0_4_ =
                 fVar228 * fVar207 + fVar119 * fVar150 + fVar26 * fVar166 + fVar153 * fVar236;
            auVar155._4_4_ =
                 fVar228 * fVar172 + fVar119 * fVar151 + fVar26 * fVar167 + fVar153 * fVar10;
            auVar155._8_4_ =
                 fVar228 * fVar169 + fVar119 * fVar162 + fVar26 * fVar182 + fVar153 * fVar11;
            auVar155._12_4_ =
                 fVar228 * fVar123 + fVar119 * fVar163 + fVar26 * fVar226 + fVar153 * fVar88;
            auVar194._0_4_ =
                 fVar234 * fVar207 + fVar124 * fVar150 + fVar66 * fVar166 + fVar171 * fVar236;
            auVar194._4_4_ =
                 fVar234 * fVar172 + fVar124 * fVar151 + fVar66 * fVar167 + fVar171 * fVar10;
            auVar194._8_4_ =
                 fVar234 * fVar169 + fVar124 * fVar162 + fVar66 * fVar182 + fVar171 * fVar11;
            auVar194._12_4_ =
                 fVar234 * fVar123 + fVar124 * fVar163 + fVar66 * fVar226 + fVar171 * fVar88;
            auVar174._0_4_ =
                 fVar207 * fVar120 + fVar150 * fVar197 + fVar166 * fVar67 + fVar236 * fVar188;
            auVar174._4_4_ =
                 fVar172 * fVar120 + fVar151 * fVar197 + fVar167 * fVar67 + fVar10 * fVar188;
            auVar174._8_4_ =
                 fVar169 * fVar120 + fVar162 * fVar197 + fVar182 * fVar67 + fVar11 * fVar188;
            auVar174._12_4_ =
                 fVar123 * fVar120 + fVar163 * fVar197 + fVar226 * fVar67 + fVar88 * fVar188;
            lVar18 = lVar14 * 4;
            fVar207 = *(float *)(bezier_basis0 + lVar18 + 0x13ec);
            fVar172 = *(float *)(bezier_basis0 + lVar18 + 0x13f0);
            fVar169 = *(float *)(bezier_basis0 + lVar18 + 0x13f4);
            fVar123 = *(float *)(bezier_basis0 + lVar18 + 0x13f8);
            lVar18 = lVar14 * 4;
            fVar150 = *(float *)(bezier_basis0 + lVar18 + 0x1870);
            fVar151 = *(float *)(bezier_basis0 + lVar18 + 0x1874);
            fVar162 = *(float *)(bezier_basis0 + lVar18 + 0x1878);
            fVar163 = *(float *)(bezier_basis0 + lVar18 + 0x187c);
            lVar18 = lVar14 * 4;
            fVar166 = *(float *)(bezier_basis0 + lVar18 + 0x1cf4);
            fVar167 = *(float *)(bezier_basis0 + lVar18 + 0x1cf8);
            fVar182 = *(float *)(bezier_basis0 + lVar18 + 0x1cfc);
            fVar226 = *(float *)(bezier_basis0 + lVar18 + 0x1d00);
            lVar18 = lVar14 * 4;
            fVar236 = *(float *)(bezier_basis0 + lVar18 + 0x2178);
            fVar10 = *(float *)(bezier_basis0 + lVar18 + 0x217c);
            fVar11 = *(float *)(bezier_basis0 + lVar18 + 0x2180);
            fVar88 = *(float *)(bezier_basis0 + lVar18 + 0x2184);
            fVar198 = fVar228 * fVar207 + fVar119 * fVar150 + fVar26 * fVar166 + fVar153 * fVar236;
            fVar206 = fVar228 * fVar172 + fVar119 * fVar151 + fVar26 * fVar167 + fVar153 * fVar10;
            fVar208 = fVar228 * fVar169 + fVar119 * fVar162 + fVar26 * fVar182 + fVar153 * fVar11;
            fVar210 = fVar228 * fVar123 + fVar119 * fVar163 + fVar26 * fVar226 + fVar153 * fVar88;
            fVar211 = fVar234 * fVar207 + fVar124 * fVar150 + fVar66 * fVar166 + fVar171 * fVar236;
            fVar217 = fVar234 * fVar172 + fVar124 * fVar151 + fVar66 * fVar167 + fVar171 * fVar10;
            fVar218 = fVar234 * fVar169 + fVar124 * fVar162 + fVar66 * fVar182 + fVar171 * fVar11;
            fVar219 = fVar234 * fVar123 + fVar124 * fVar163 + fVar66 * fVar226 + fVar171 * fVar88;
            fVar207 = fVar207 * fVar120 + fVar150 * fVar197 + fVar166 * fVar67 + fVar236 * fVar188;
            fVar172 = fVar172 * fVar120 + fVar151 * fVar197 + fVar167 * fVar67 + fVar10 * fVar188;
            fVar169 = fVar169 * fVar120 + fVar162 * fVar197 + fVar182 * fVar67 + fVar11 * fVar188;
            fVar123 = fVar123 * fVar120 + fVar163 * fVar197 + fVar226 * fVar67 + fVar88 * fVar188;
            uVar125 = -(uint)(uVar121 == 0);
            uVar138 = -(uint)(uVar121 == 1);
            uVar139 = -(uint)(uVar121 == 2);
            uVar140 = -(uint)(uVar121 == 3);
            uVar141 = -(uint)(uVar121 == 7);
            uVar146 = -(uint)(uVar121 == 6);
            uVar147 = -(uint)(uVar121 == 5);
            uVar148 = -(uint)(uVar121 == 4);
            auVar221._0_4_ = (float)(~uVar141 & (uint)fVar198) * 0.055555556 + auVar155._0_4_;
            auVar221._4_4_ = (float)(~uVar146 & (uint)fVar206) * 0.055555556 + auVar155._4_4_;
            auVar221._8_4_ = (float)(~uVar147 & (uint)fVar208) * 0.055555556 + auVar155._8_4_;
            auVar221._12_4_ = (float)(~uVar148 & (uint)fVar210) * 0.055555556 + auVar155._12_4_;
            auVar126 = minps(local_2b8,auVar155);
            auVar173 = maxps(local_288,auVar155);
            auVar156._0_8_ =
                 CONCAT44(auVar155._4_4_ - (float)(~uVar138 & (uint)fVar206) * 0.055555556,
                          auVar155._0_4_ - (float)(~uVar125 & (uint)fVar198) * 0.055555556);
            auVar156._8_4_ = auVar155._8_4_ - (float)(~uVar139 & (uint)fVar208) * 0.055555556;
            auVar156._12_4_ = auVar155._12_4_ - (float)(~uVar140 & (uint)fVar210) * 0.055555556;
            auVar189._0_4_ = (float)(~uVar141 & (uint)fVar211) * 0.055555556 + auVar194._0_4_;
            auVar189._4_4_ = (float)(~uVar146 & (uint)fVar217) * 0.055555556 + auVar194._4_4_;
            auVar189._8_4_ = (float)(~uVar147 & (uint)fVar218) * 0.055555556 + auVar194._8_4_;
            auVar189._12_4_ = (float)(~uVar148 & (uint)fVar219) * 0.055555556 + auVar194._12_4_;
            auVar104 = minps(local_2a8,auVar194);
            auVar212 = maxps(auVar143,auVar194);
            auVar195._0_8_ =
                 CONCAT44(auVar194._4_4_ - (float)(~uVar138 & (uint)fVar217) * 0.055555556,
                          auVar194._0_4_ - (float)(~uVar125 & (uint)fVar211) * 0.055555556);
            auVar195._8_4_ = auVar194._8_4_ - (float)(~uVar139 & (uint)fVar218) * 0.055555556;
            auVar195._12_4_ = auVar194._12_4_ - (float)(~uVar140 & (uint)fVar219) * 0.055555556;
            auVar27._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar27._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar27._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar27._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar142._0_4_ = (float)(~uVar141 & (uint)fVar207) * 0.055555556 + auVar174._0_4_;
            auVar142._4_4_ = (float)(~uVar146 & (uint)fVar172) * 0.055555556 + auVar174._4_4_;
            auVar142._8_4_ = (float)(~uVar147 & (uint)fVar169) * 0.055555556 + auVar174._8_4_;
            auVar142._12_4_ = (float)(~uVar148 & (uint)fVar123) * 0.055555556 + auVar174._12_4_;
            auVar229 = minps(local_298,auVar174);
            auVar69 = maxps(auVar222,auVar174);
            auVar175._0_8_ =
                 CONCAT44(auVar174._4_4_ - (float)(~uVar138 & (uint)fVar172) * 0.055555556,
                          auVar174._0_4_ - (float)(~uVar125 & (uint)fVar207) * 0.055555556);
            auVar175._8_4_ = auVar174._8_4_ - (float)(~uVar139 & (uint)fVar169) * 0.055555556;
            auVar175._12_4_ = auVar174._12_4_ - (float)(~uVar140 & (uint)fVar123) * 0.055555556;
            auVar127._8_4_ = auVar156._8_4_;
            auVar127._0_8_ = auVar156._0_8_;
            auVar127._12_4_ = auVar156._12_4_;
            auVar128 = minps(auVar127,auVar221);
            auVar128 = minps(auVar126,auVar128);
            auVar129._8_4_ = auVar195._8_4_;
            auVar129._0_8_ = auVar195._0_8_;
            auVar129._12_4_ = auVar195._12_4_;
            auVar126 = minps(auVar129,auVar189);
            auVar126 = minps(auVar104,auVar126);
            auVar130._8_4_ = auVar175._8_4_;
            auVar130._0_8_ = auVar175._0_8_;
            auVar130._12_4_ = auVar175._12_4_;
            auVar104 = minps(auVar130,auVar142);
            auVar104 = minps(auVar229,auVar104);
            local_2b8 = local_2b8 & auVar27 | ~auVar27 & auVar128;
            auVar183._0_4_ = local_2a8._0_4_ & auVar27._0_4_;
            auVar183._4_4_ = local_2a8._4_4_ & auVar27._4_4_;
            auVar183._8_4_ = local_2a8._8_4_ & auVar27._8_4_;
            auVar183._12_4_ = local_2a8._12_4_ & auVar27._12_4_;
            local_2a8 = auVar183 | ~auVar27 & auVar126;
            uVar121 = local_298._0_4_ & auVar27._0_4_ | ~auVar27._0_4_ & auVar104._0_4_;
            uVar125 = local_298._4_4_ & auVar27._4_4_ | ~auVar27._4_4_ & auVar104._4_4_;
            uVar138 = local_298._8_4_ & auVar27._8_4_ | ~auVar27._8_4_ & auVar104._8_4_;
            local_298._12_4_ = local_298._12_4_ & auVar27._12_4_ | ~auVar27._12_4_ & auVar104._12_4_
            ;
            local_298._4_4_ = uVar125;
            local_298._0_4_ = uVar121;
            local_298._8_4_ = uVar138;
            auVar126 = maxps(auVar156,auVar221);
            auVar173 = maxps(auVar173,auVar126);
            auVar126 = maxps(auVar195,auVar189);
            auVar104 = maxps(auVar212,auVar126);
            auVar126 = maxps(auVar175,auVar142);
            auVar126 = maxps(auVar69,auVar126);
            uVar139 = local_288._0_4_ & auVar27._0_4_ | ~auVar27._0_4_ & auVar173._0_4_;
            uVar140 = local_288._4_4_ & auVar27._4_4_ | ~auVar27._4_4_ & auVar173._4_4_;
            uVar141 = local_288._8_4_ & auVar27._8_4_ | ~auVar27._8_4_ & auVar173._8_4_;
            local_288._12_4_ = local_288._12_4_ & auVar27._12_4_ | ~auVar27._12_4_ & auVar173._12_4_
            ;
            local_288._4_4_ = uVar140;
            local_288._0_4_ = uVar139;
            local_288._8_4_ = uVar141;
            auVar28._0_4_ = ~auVar27._0_4_ & auVar104._0_4_;
            auVar28._4_4_ = ~auVar27._4_4_ & auVar104._4_4_;
            auVar28._8_4_ = ~auVar27._8_4_ & auVar104._8_4_;
            auVar28._12_4_ = ~auVar27._12_4_ & auVar104._12_4_;
            local_278._0_4_ = auVar143._0_4_;
            local_278._4_4_ = auVar143._4_4_;
            fStack_270 = auVar143._8_4_;
            fStack_26c = auVar143._12_4_;
            auVar143._0_4_ = local_278._0_4_ & auVar27._0_4_;
            auVar143._4_4_ = local_278._4_4_ & auVar27._4_4_;
            auVar143._8_4_ = (uint)fStack_270 & auVar27._8_4_;
            auVar143._12_4_ = (uint)fStack_26c & auVar27._12_4_;
            auVar143 = auVar143 | auVar28;
            local_228._0_4_ = auVar222._0_4_;
            local_228._4_4_ = auVar222._4_4_;
            fStack_220 = auVar222._8_4_;
            fStack_21c = auVar222._12_4_;
            auVar29._0_4_ = local_228._0_4_ & auVar27._0_4_;
            auVar29._4_4_ = local_228._4_4_ & auVar27._4_4_;
            auVar29._8_4_ = (uint)fStack_220 & auVar27._8_4_;
            auVar29._12_4_ = (uint)fStack_21c & auVar27._12_4_;
            auVar222._4_4_ = ~auVar27._4_4_ & auVar126._4_4_;
            auVar222._0_4_ = ~auVar27._0_4_ & auVar126._0_4_;
            auVar222._8_4_ = ~auVar27._8_4_ & auVar126._8_4_;
            auVar222._12_4_ = ~auVar27._12_4_ & auVar126._12_4_;
            auVar222 = auVar222 | auVar29;
            lVar14 = lVar14 + 4;
          } while (lVar14 == 4);
          fVar227 = fVar227 + fVar122;
          fVar233 = fVar233 + fVar209;
          fVar235 = fVar235 + fVar205;
          fVar220 = fVar220 + fVar103;
          fVar224 = fVar224 + fVar111;
          fVar225 = fVar225 + fVar112;
          fVar103 = (fVar164 + fVar149) * 0.33333334 + fVar227;
          fVar111 = (fVar168 + fVar161) * 0.33333334 + fVar233;
          fVar112 = (fVar152 + fVar165) * 0.33333334 + fVar235;
          fVar26 = fVar220 - (fVar113 + fVar170) * 0.33333334;
          fVar66 = fVar224 - (fVar68 + fVar180) * 0.33333334;
          fVar67 = fVar225 - (fVar114 + fVar181) * 0.33333334;
          auVar30._4_4_ = local_2b8._0_4_;
          auVar30._0_4_ = local_2b8._4_4_;
          auVar30._8_4_ = local_2b8._12_4_;
          auVar30._12_4_ = local_2b8._8_4_;
          auVar126 = minps(auVar30,local_2b8);
          auVar70._0_8_ = auVar126._8_8_;
          auVar70._8_4_ = auVar126._0_4_;
          auVar70._12_4_ = auVar126._4_4_;
          auVar173 = minps(auVar70,auVar126);
          auVar31._4_4_ = local_2a8._0_4_;
          auVar31._0_4_ = local_2a8._4_4_;
          auVar31._8_4_ = local_2a8._12_4_;
          auVar31._12_4_ = local_2a8._8_4_;
          auVar126 = minps(auVar31,local_2a8);
          auVar89._0_8_ = auVar126._8_8_;
          auVar89._8_4_ = auVar126._0_4_;
          auVar89._12_4_ = auVar126._4_4_;
          auVar69 = minps(auVar89,auVar126);
          auVar32._4_4_ = uVar121;
          auVar32._0_4_ = uVar125;
          auVar32._8_4_ = local_298._12_4_;
          auVar32._12_4_ = uVar138;
          auVar126 = minps(auVar32,local_298);
          auVar33._0_8_ = auVar126._8_8_;
          auVar33._8_4_ = auVar126._0_4_;
          auVar33._12_4_ = auVar126._4_4_;
          auVar106._4_4_ = auVar69._0_4_;
          auVar106._0_4_ = auVar173._0_4_;
          auVar34._4_4_ = uVar139;
          auVar34._0_4_ = uVar140;
          auVar34._8_4_ = local_288._12_4_;
          auVar34._12_4_ = uVar141;
          auVar173 = maxps(auVar34,local_288);
          auVar71._0_8_ = auVar173._8_8_;
          auVar71._8_4_ = auVar173._0_4_;
          auVar71._12_4_ = auVar173._4_4_;
          auVar69 = maxps(auVar71,auVar173);
          auVar35._4_4_ = auVar143._0_4_;
          auVar35._0_4_ = auVar143._4_4_;
          auVar35._8_4_ = auVar143._12_4_;
          auVar35._12_4_ = auVar143._8_4_;
          auVar173 = maxps(auVar35,auVar143);
          auVar90._0_8_ = auVar173._8_8_;
          auVar90._8_4_ = auVar173._0_4_;
          auVar90._12_4_ = auVar173._4_4_;
          auVar104 = maxps(auVar90,auVar173);
          auVar36._4_4_ = auVar222._0_4_;
          auVar36._0_4_ = auVar222._4_4_;
          auVar36._8_4_ = auVar222._12_4_;
          auVar36._12_4_ = auVar222._8_4_;
          auVar173 = maxps(auVar36,auVar222);
          auVar37._0_8_ = auVar173._8_8_;
          auVar37._8_4_ = auVar173._0_4_;
          auVar37._12_4_ = auVar173._4_4_;
          auVar115._4_4_ = auVar104._0_4_;
          auVar115._0_4_ = auVar69._0_4_;
          lVar14 = 0;
          local_2a8._8_8_ = 0x7f8000007f800000;
          local_2a8._0_8_ = 0x7f8000007f800000;
          local_258._8_8_ = 0x7f8000007f800000;
          local_258._0_8_ = 0x7f8000007f800000;
          local_2b8._8_8_ = 0x7f8000007f800000;
          local_2b8._0_8_ = 0x7f8000007f800000;
          local_288 = _DAT_01feba00;
          local_298 = _DAT_01feba00;
          auVar133 = _DAT_01feba00;
          do {
            uVar121 = (uint)lVar14;
            lVar18 = lVar14 * 4;
            fVar68 = *(float *)(bezier_basis0 + lVar18 + 0x1dc);
            fVar113 = *(float *)(bezier_basis0 + lVar18 + 0x1e0);
            fVar114 = *(float *)(bezier_basis0 + lVar18 + 0x1e4);
            fVar119 = *(float *)(bezier_basis0 + lVar18 + 0x1e8);
            lVar18 = lVar14 * 4;
            fVar122 = *(float *)(bezier_basis0 + lVar18 + 0x660);
            fVar124 = *(float *)(bezier_basis0 + lVar18 + 0x664);
            fVar209 = *(float *)(bezier_basis0 + lVar18 + 0x668);
            fVar197 = *(float *)(bezier_basis0 + lVar18 + 0x66c);
            lVar18 = lVar14 * 4;
            fVar205 = *(float *)(bezier_basis0 + lVar18 + 0xae4);
            fVar207 = *(float *)(bezier_basis0 + lVar18 + 0xae8);
            fVar164 = *(float *)(bezier_basis0 + lVar18 + 0xaec);
            fVar168 = *(float *)(bezier_basis0 + lVar18 + 0xaf0);
            lVar18 = lVar14 * 4;
            fVar152 = *(float *)(bezier_basis0 + lVar18 + 0xf68);
            fVar153 = *(float *)(bezier_basis0 + lVar18 + 0xf6c);
            fVar171 = *(float *)(bezier_basis0 + lVar18 + 0xf70);
            fVar172 = *(float *)(bezier_basis0 + lVar18 + 0xf74);
            auVar131._0_4_ =
                 fVar227 * fVar68 + fVar103 * fVar122 + fVar26 * fVar205 + fVar220 * fVar152;
            auVar131._4_4_ =
                 fVar227 * fVar113 + fVar103 * fVar124 + fVar26 * fVar207 + fVar220 * fVar153;
            auVar131._8_4_ =
                 fVar227 * fVar114 + fVar103 * fVar209 + fVar26 * fVar164 + fVar220 * fVar171;
            auVar131._12_4_ =
                 fVar227 * fVar119 + fVar103 * fVar197 + fVar26 * fVar168 + fVar220 * fVar172;
            auVar184._0_4_ =
                 fVar233 * fVar68 + fVar111 * fVar122 + fVar66 * fVar205 + fVar224 * fVar152;
            auVar184._4_4_ =
                 fVar233 * fVar113 + fVar111 * fVar124 + fVar66 * fVar207 + fVar224 * fVar153;
            auVar184._8_4_ =
                 fVar233 * fVar114 + fVar111 * fVar209 + fVar66 * fVar164 + fVar224 * fVar171;
            auVar184._12_4_ =
                 fVar233 * fVar119 + fVar111 * fVar197 + fVar66 * fVar168 + fVar224 * fVar172;
            local_1c8._0_4_ =
                 fVar68 * fVar235 + fVar122 * fVar112 + fVar205 * fVar67 + fVar152 * fVar225;
            local_1c8._4_4_ =
                 fVar113 * fVar235 + fVar124 * fVar112 + fVar207 * fVar67 + fVar153 * fVar225;
            fStack_1c0 = fVar114 * fVar235 +
                         fVar209 * fVar112 + fVar164 * fVar67 + fVar171 * fVar225;
            fStack_1bc = fVar119 * fVar235 +
                         fVar197 * fVar112 + fVar168 * fVar67 + fVar172 * fVar225;
            lVar18 = lVar14 * 4;
            fVar68 = *(float *)(bezier_basis0 + lVar18 + 0x13ec);
            fVar113 = *(float *)(bezier_basis0 + lVar18 + 0x13f0);
            fVar114 = *(float *)(bezier_basis0 + lVar18 + 0x13f4);
            fVar119 = *(float *)(bezier_basis0 + lVar18 + 0x13f8);
            lVar18 = lVar14 * 4;
            fVar122 = *(float *)(bezier_basis0 + lVar18 + 0x1870);
            fVar124 = *(float *)(bezier_basis0 + lVar18 + 0x1874);
            fVar209 = *(float *)(bezier_basis0 + lVar18 + 0x1878);
            fVar197 = *(float *)(bezier_basis0 + lVar18 + 0x187c);
            lVar18 = lVar14 * 4;
            fVar205 = *(float *)(bezier_basis0 + lVar18 + 0x1cf4);
            fVar207 = *(float *)(bezier_basis0 + lVar18 + 0x1cf8);
            fVar164 = *(float *)(bezier_basis0 + lVar18 + 0x1cfc);
            fVar168 = *(float *)(bezier_basis0 + lVar18 + 0x1d00);
            lVar18 = lVar14 * 4;
            fVar152 = *(float *)(bezier_basis0 + lVar18 + 0x2178);
            fVar153 = *(float *)(bezier_basis0 + lVar18 + 0x217c);
            fVar171 = *(float *)(bezier_basis0 + lVar18 + 0x2180);
            fVar172 = *(float *)(bezier_basis0 + lVar18 + 0x2184);
            fVar161 = fVar227 * fVar68 + fVar103 * fVar122 + fVar26 * fVar205 + fVar220 * fVar152;
            fVar165 = fVar227 * fVar113 + fVar103 * fVar124 + fVar26 * fVar207 + fVar220 * fVar153;
            fVar169 = fVar227 * fVar114 + fVar103 * fVar209 + fVar26 * fVar164 + fVar220 * fVar171;
            fVar120 = fVar227 * fVar119 + fVar103 * fVar197 + fVar26 * fVar168 + fVar220 * fVar172;
            fVar188 = fVar233 * fVar68 + fVar111 * fVar122 + fVar66 * fVar205 + fVar224 * fVar152;
            fVar228 = fVar233 * fVar113 + fVar111 * fVar124 + fVar66 * fVar207 + fVar224 * fVar153;
            fVar234 = fVar233 * fVar114 + fVar111 * fVar209 + fVar66 * fVar164 + fVar224 * fVar171;
            fVar149 = fVar233 * fVar119 + fVar111 * fVar197 + fVar66 * fVar168 + fVar224 * fVar172;
            fVar68 = fVar68 * fVar235 + fVar122 * fVar112 + fVar205 * fVar67 + fVar152 * fVar225;
            fVar113 = fVar113 * fVar235 + fVar124 * fVar112 + fVar207 * fVar67 + fVar153 * fVar225;
            fVar114 = fVar114 * fVar235 + fVar209 * fVar112 + fVar164 * fVar67 + fVar171 * fVar225;
            fVar119 = fVar119 * fVar235 + fVar197 * fVar112 + fVar168 * fVar67 + fVar172 * fVar225;
            uVar141 = -(uint)(uVar121 == 0);
            uVar146 = -(uint)(uVar121 == 1);
            uVar147 = -(uint)(uVar121 == 2);
            uVar148 = -(uint)(uVar121 == 3);
            uVar125 = -(uint)(uVar121 == 7);
            uVar138 = -(uint)(uVar121 == 6);
            uVar139 = -(uint)(uVar121 == 5);
            uVar140 = -(uint)(uVar121 == 4);
            local_228._4_4_ = (float)(~uVar138 & (uint)fVar165) * 0.055555556 + auVar131._4_4_;
            local_228._0_4_ = (float)(~uVar125 & (uint)fVar161) * 0.055555556 + auVar131._0_4_;
            fStack_220 = (float)(~uVar139 & (uint)fVar169) * 0.055555556 + auVar131._8_4_;
            fStack_21c = (float)(~uVar140 & (uint)fVar120) * 0.055555556 + auVar131._12_4_;
            auVar143 = minps(local_2b8,auVar131);
            auVar104 = maxps(local_298,auVar131);
            auVar132._0_8_ =
                 CONCAT44(auVar131._4_4_ - (float)(~uVar146 & (uint)fVar165) * 0.055555556,
                          auVar131._0_4_ - (float)(~uVar141 & (uint)fVar161) * 0.055555556);
            auVar132._8_4_ = auVar131._8_4_ - (float)(~uVar147 & (uint)fVar169) * 0.055555556;
            auVar132._12_4_ = auVar131._12_4_ - (float)(~uVar148 & (uint)fVar120) * 0.055555556;
            auVar199._0_4_ = (float)(~uVar125 & (uint)fVar188) * 0.055555556 + auVar184._0_4_;
            auVar199._4_4_ = (float)(~uVar138 & (uint)fVar228) * 0.055555556 + auVar184._4_4_;
            auVar199._8_4_ = (float)(~uVar139 & (uint)fVar234) * 0.055555556 + auVar184._8_4_;
            auVar199._12_4_ = (float)(~uVar140 & (uint)fVar149) * 0.055555556 + auVar184._12_4_;
            auVar212 = minps(local_258,auVar184);
            auVar222 = maxps(local_288,auVar184);
            auVar185._0_8_ =
                 CONCAT44(auVar184._4_4_ - (float)(~uVar146 & (uint)fVar228) * 0.055555556,
                          auVar184._0_4_ - (float)(~uVar141 & (uint)fVar188) * 0.055555556);
            auVar185._8_4_ = auVar184._8_4_ - (float)(~uVar147 & (uint)fVar234) * 0.055555556;
            auVar185._12_4_ = auVar184._12_4_ - (float)(~uVar148 & (uint)fVar149) * 0.055555556;
            auVar105._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar105._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar105._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar105._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar121 ^ 0x80000000));
            auVar157._0_4_ = (float)(~uVar125 & (uint)fVar68) * 0.055555556 + (float)local_1c8._0_4_
            ;
            auVar157._4_4_ =
                 (float)(~uVar138 & (uint)fVar113) * 0.055555556 + (float)local_1c8._4_4_;
            auVar157._8_4_ = (float)(~uVar139 & (uint)fVar114) * 0.055555556 + fStack_1c0;
            auVar157._12_4_ = (float)(~uVar140 & (uint)fVar119) * 0.055555556 + fStack_1bc;
            auVar69 = minps(local_2a8,_local_1c8);
            auVar128 = maxps(auVar133,_local_1c8);
            auVar144._0_8_ =
                 CONCAT44((float)local_1c8._4_4_ - (float)(~uVar146 & (uint)fVar113) * 0.055555556,
                          (float)local_1c8._0_4_ - (float)(~uVar141 & (uint)fVar68) * 0.055555556);
            auVar144._8_4_ = fStack_1c0 - (float)(~uVar147 & (uint)fVar114) * 0.055555556;
            auVar144._12_4_ = fStack_1bc - (float)(~uVar148 & (uint)fVar119) * 0.055555556;
            auVar176._8_4_ = auVar132._8_4_;
            auVar176._0_8_ = auVar132._0_8_;
            auVar176._12_4_ = auVar132._12_4_;
            auVar229 = minps(auVar176,_local_228);
            auVar143 = minps(auVar143,auVar229);
            auVar177._8_4_ = auVar185._8_4_;
            auVar177._0_8_ = auVar185._0_8_;
            auVar177._12_4_ = auVar185._12_4_;
            auVar229 = minps(auVar177,auVar199);
            auVar212 = minps(auVar212,auVar229);
            auVar178._8_4_ = auVar144._8_4_;
            auVar178._0_8_ = auVar144._0_8_;
            auVar178._12_4_ = auVar144._12_4_;
            auVar229 = minps(auVar178,auVar157);
            auVar69 = minps(auVar69,auVar229);
            local_2b8 = local_2b8 & auVar105 | ~auVar105 & auVar143;
            auVar213._0_4_ = local_258._0_4_ & auVar105._0_4_;
            auVar213._4_4_ = local_258._4_4_ & auVar105._4_4_;
            auVar213._8_4_ = local_258._8_4_ & auVar105._8_4_;
            auVar213._12_4_ = local_258._12_4_ & auVar105._12_4_;
            local_258 = auVar213 | ~auVar105 & auVar212;
            uVar121 = local_2a8._0_4_ & auVar105._0_4_ | ~auVar105._0_4_ & auVar69._0_4_;
            uVar125 = local_2a8._4_4_ & auVar105._4_4_ | ~auVar105._4_4_ & auVar69._4_4_;
            uVar138 = local_2a8._8_4_ & auVar105._8_4_ | ~auVar105._8_4_ & auVar69._8_4_;
            local_2a8._12_4_ =
                 local_2a8._12_4_ & auVar105._12_4_ | ~auVar105._12_4_ & auVar69._12_4_;
            local_2a8._4_4_ = uVar125;
            local_2a8._0_4_ = uVar121;
            local_2a8._8_4_ = uVar138;
            auVar69 = maxps(auVar132,_local_228);
            auVar104 = maxps(auVar104,auVar69);
            auVar69 = maxps(auVar185,auVar199);
            auVar212 = maxps(auVar222,auVar69);
            auVar69 = maxps(auVar144,auVar157);
            auVar69 = maxps(auVar128,auVar69);
            uVar139 = local_298._0_4_ & auVar105._0_4_ | ~auVar105._0_4_ & auVar104._0_4_;
            uVar140 = local_298._4_4_ & auVar105._4_4_ | ~auVar105._4_4_ & auVar104._4_4_;
            uVar141 = local_298._8_4_ & auVar105._8_4_ | ~auVar105._8_4_ & auVar104._8_4_;
            local_298._12_4_ =
                 local_298._12_4_ & auVar105._12_4_ | ~auVar105._12_4_ & auVar104._12_4_;
            local_298._4_4_ = uVar140;
            local_298._0_4_ = uVar139;
            local_298._8_4_ = uVar141;
            auVar72._0_4_ = ~auVar105._0_4_ & auVar212._0_4_;
            auVar72._4_4_ = ~auVar105._4_4_ & auVar212._4_4_;
            auVar72._8_4_ = ~auVar105._8_4_ & auVar212._8_4_;
            auVar72._12_4_ = ~auVar105._12_4_ & auVar212._12_4_;
            auVar230._0_4_ = local_288._0_4_ & auVar105._0_4_;
            auVar230._4_4_ = local_288._4_4_ & auVar105._4_4_;
            auVar230._8_4_ = local_288._8_4_ & auVar105._8_4_;
            auVar230._12_4_ = local_288._12_4_ & auVar105._12_4_;
            local_288 = auVar230 | auVar72;
            local_278._0_4_ = auVar133._0_4_;
            local_278._4_4_ = auVar133._4_4_;
            fStack_270 = auVar133._8_4_;
            fStack_26c = auVar133._12_4_;
            auVar73._0_4_ = local_278._0_4_ & auVar105._0_4_;
            auVar73._4_4_ = local_278._4_4_ & auVar105._4_4_;
            auVar73._8_4_ = (uint)fStack_270 & auVar105._8_4_;
            auVar73._12_4_ = (uint)fStack_26c & auVar105._12_4_;
            auVar133._4_4_ = ~auVar105._4_4_ & auVar69._4_4_;
            auVar133._0_4_ = ~auVar105._0_4_ & auVar69._0_4_;
            auVar133._8_4_ = ~auVar105._8_4_ & auVar69._8_4_;
            auVar133._12_4_ = ~auVar105._12_4_ & auVar69._12_4_;
            auVar133 = auVar133 | auVar73;
            lVar14 = lVar14 + 4;
          } while (lVar14 == 4);
          auVar126 = minps(auVar33,auVar126);
          auVar106._8_4_ = auVar126._0_4_;
          auVar106._12_4_ = 0;
          auVar126 = maxps(auVar37,auVar173);
          auVar115._8_4_ = auVar126._0_4_;
          auVar115._12_4_ = 0;
          auVar38._4_4_ = local_2b8._0_4_;
          auVar38._0_4_ = local_2b8._4_4_;
          auVar38._8_4_ = local_2b8._12_4_;
          auVar38._12_4_ = local_2b8._8_4_;
          auVar126 = minps(auVar38,local_2b8);
          auVar74._0_8_ = auVar126._8_8_;
          auVar74._8_4_ = auVar126._0_4_;
          auVar74._12_4_ = auVar126._4_4_;
          auVar173 = minps(auVar74,auVar126);
          auVar39._4_4_ = local_258._0_4_;
          auVar39._0_4_ = local_258._4_4_;
          auVar39._8_4_ = local_258._12_4_;
          auVar39._12_4_ = local_258._8_4_;
          auVar126 = minps(auVar39,local_258);
          auVar91._0_8_ = auVar126._8_8_;
          auVar91._8_4_ = auVar126._0_4_;
          auVar91._12_4_ = auVar126._4_4_;
          auVar69 = minps(auVar91,auVar126);
          auVar40._4_4_ = uVar121;
          auVar40._0_4_ = uVar125;
          auVar40._8_4_ = local_2a8._12_4_;
          auVar40._12_4_ = uVar138;
          auVar126 = minps(auVar40,local_2a8);
          auVar75._0_8_ = auVar126._8_8_;
          auVar75._8_4_ = auVar126._0_4_;
          auVar75._12_4_ = auVar126._4_4_;
          auVar126 = minps(auVar75,auVar126);
          auVar92._4_4_ = auVar69._0_4_;
          auVar92._0_4_ = auVar173._0_4_;
          auVar92._8_4_ = auVar126._0_4_;
          auVar92._12_4_ = 0;
          auVar104 = minps(auVar106,auVar92);
          auVar41._4_4_ = uVar139;
          auVar41._0_4_ = uVar140;
          auVar41._8_4_ = local_298._12_4_;
          auVar41._12_4_ = uVar141;
          auVar126 = maxps(auVar41,local_298);
          auVar76._0_8_ = auVar126._8_8_;
          auVar76._8_4_ = auVar126._0_4_;
          auVar76._12_4_ = auVar126._4_4_;
          auVar173 = maxps(auVar76,auVar126);
          auVar42._4_4_ = local_288._0_4_;
          auVar42._0_4_ = local_288._4_4_;
          auVar42._8_4_ = local_288._12_4_;
          auVar42._12_4_ = local_288._8_4_;
          auVar126 = maxps(auVar42,local_288);
          auVar93._0_8_ = auVar126._8_8_;
          auVar93._8_4_ = auVar126._0_4_;
          auVar93._12_4_ = auVar126._4_4_;
          auVar69 = maxps(auVar93,auVar126);
          auVar43._4_4_ = auVar133._0_4_;
          auVar43._0_4_ = auVar133._4_4_;
          auVar43._8_4_ = auVar133._12_4_;
          auVar43._12_4_ = auVar133._8_4_;
          auVar126 = maxps(auVar43,auVar133);
          auVar77._0_8_ = auVar126._8_8_;
          auVar77._8_4_ = auVar126._0_4_;
          auVar77._12_4_ = auVar126._4_4_;
          auVar126 = maxps(auVar77,auVar126);
          auVar94._4_4_ = auVar69._0_4_;
          auVar94._0_4_ = auVar173._0_4_;
          auVar94._8_4_ = auVar126._0_4_;
          auVar94._12_4_ = 0;
          auVar126 = maxps(auVar115,auVar94);
          auVar116._0_4_ = -(uint)(auVar126._0_4_ < 1.844e+18 && -1.844e+18 < auVar104._0_4_);
          auVar116._4_4_ = -(uint)(auVar126._4_4_ < 1.844e+18 && -1.844e+18 < auVar104._4_4_);
          auVar116._8_4_ = -(uint)(auVar126._8_4_ < 1.844e+18 && -1.844e+18 < auVar104._8_4_);
          auVar116._12_4_ = -(uint)(auVar126._12_4_ < 1.844e+18 && -1.844e+18 < auVar104._12_4_);
          uVar17 = movmskps((int)pcVar8,auVar116);
          if ((~(byte)uVar17 & 7) != 0) goto LAB_00a69ed8;
          bVar24 = uVar13 <= uVar15;
          bVar25 = uVar15 != uVar13;
          uVar15 = uVar15 + 1;
        } while (bVar25);
        pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar6->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar8 + sVar9 * uVar16);
        fVar26 = *pfVar1;
        fVar66 = pfVar1[1];
        fVar67 = pfVar1[2];
        pfVar2 = (float *)(pcVar8 + sVar9 * (uVar12 + 1));
        pfVar3 = (float *)(pcVar8 + sVar9 * (uVar12 + 2));
        pfVar4 = (float *)(pcVar8 + sVar9 * uVar21);
        fVar68 = *pfVar4;
        fVar103 = pfVar4[1];
        fVar111 = pfVar4[2];
        fVar154 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  maxRadiusScale;
        fVar164 = pfVar1[3] * fVar154;
        fVar168 = pfVar4[3] * fVar154;
        pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar7->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar8 + uVar16 * sVar9);
        fVar112 = *pfVar1;
        fVar113 = pfVar1[1];
        fVar114 = pfVar1[2];
        pfVar1 = (float *)(pcVar8 + (uVar12 + 1) * sVar9);
        pfVar4 = (float *)(pcVar8 + (uVar12 + 2) * sVar9);
        pfVar5 = (float *)(pcVar8 + sVar9 * uVar21);
        fVar119 = *pfVar5;
        fVar122 = pfVar5[1];
        fVar124 = pfVar5[2];
        fVar233 = *pfVar3 * 0.0;
        fVar151 = pfVar3[1] * 0.0;
        fVar166 = pfVar3[2] * 0.0;
        fVar170 = pfVar3[3] * fVar154 * 0.0;
        fVar209 = fVar68 * 0.0 + fVar233;
        fVar197 = fVar103 * 0.0 + fVar151;
        fVar205 = fVar111 * 0.0 + fVar166;
        fVar207 = fVar168 * 0.0 + fVar170;
        fVar123 = *pfVar2 * 0.0;
        fVar235 = pfVar2[1] * 0.0;
        fVar162 = pfVar2[2] * 0.0;
        fVar167 = pfVar2[3] * fVar154 * 0.0;
        fVar153 = fVar123 + fVar209 + fVar26;
        fVar172 = fVar235 + fVar197 + fVar66;
        fVar228 = fVar162 + fVar205 + fVar67;
        fVar180 = fVar167 + fVar207 + fVar164;
        fVar209 = (*pfVar2 * 3.0 + fVar209) - fVar26 * 3.0;
        fVar197 = (pfVar2[1] * 3.0 + fVar197) - fVar66 * 3.0;
        fVar205 = (pfVar2[2] * 3.0 + fVar205) - fVar67 * 3.0;
        fVar207 = (pfVar2[3] * fVar154 * 3.0 + fVar207) - fVar164 * 3.0;
        fVar165 = *pfVar4 * 0.0;
        fVar169 = pfVar4[1] * 0.0;
        fVar120 = pfVar4[2] * 0.0;
        fVar152 = fVar119 * 0.0 + fVar165;
        fVar171 = fVar122 * 0.0 + fVar169;
        fVar188 = fVar124 * 0.0 + fVar120;
        fVar227 = *pfVar1 * 0.0;
        fVar150 = pfVar1[1] * 0.0;
        fVar163 = pfVar1[2] * 0.0;
        fVar234 = fVar227 + fVar152 + fVar112;
        fVar149 = fVar150 + fVar171 + fVar113;
        fVar161 = fVar163 + fVar188 + fVar114;
        fVar152 = (*pfVar1 * 3.0 + fVar152) - fVar112 * 3.0;
        fVar171 = (pfVar1[1] * 3.0 + fVar171) - fVar113 * 3.0;
        fVar188 = (pfVar1[2] * 3.0 + fVar188) - fVar114 * 3.0;
        fVar233 = fVar233 + fVar68 + fVar123 + fVar26 * 0.0;
        fVar151 = fVar151 + fVar103 + fVar235 + fVar66 * 0.0;
        fVar166 = fVar166 + fVar111 + fVar162 + fVar67 * 0.0;
        fVar170 = fVar170 + fVar168 + fVar167 + fVar164 * 0.0;
        fVar123 = ((fVar68 * 3.0 - *pfVar3 * 3.0) + fVar123) - fVar26 * 0.0;
        fVar235 = ((fVar103 * 3.0 - pfVar3[1] * 3.0) + fVar235) - fVar66 * 0.0;
        fVar162 = ((fVar111 * 3.0 - pfVar3[2] * 3.0) + fVar162) - fVar67 * 0.0;
        fVar167 = ((fVar168 * 3.0 - pfVar3[3] * fVar154 * 3.0) + fVar167) - fVar164 * 0.0;
        fVar154 = fVar165 + fVar119 + fVar227 + fVar112 * 0.0;
        fVar103 = fVar169 + fVar122 + fVar150 + fVar113 * 0.0;
        fVar164 = fVar120 + fVar124 + fVar163 + fVar114 * 0.0;
        fVar26 = ((fVar119 * 3.0 - *pfVar4 * 3.0) + fVar227) - fVar112 * 0.0;
        fVar66 = ((fVar122 * 3.0 - pfVar4[1] * 3.0) + fVar150) - fVar113 * 0.0;
        fVar67 = ((fVar124 * 3.0 - pfVar4[2] * 3.0) + fVar163) - fVar114 * 0.0;
        fVar165 = fVar197 * fVar234 - fVar149 * fVar209;
        fVar169 = fVar205 * fVar149 - fVar161 * fVar197;
        fVar161 = fVar209 * fVar161 - fVar234 * fVar205;
        fVar68 = fVar197 * fVar152 - fVar171 * fVar209;
        fVar111 = fVar205 * fVar171 - fVar188 * fVar197;
        fVar168 = fVar209 * fVar188 - fVar152 * fVar205;
        fVar112 = fVar235 * fVar154 - fVar103 * fVar123;
        fVar119 = fVar162 * fVar103 - fVar164 * fVar235;
        fVar124 = fVar123 * fVar164 - fVar154 * fVar162;
        fVar154 = fVar235 * fVar26 - fVar66 * fVar123;
        fVar66 = fVar162 * fVar66 - fVar67 * fVar235;
        fVar67 = fVar123 * fVar67 - fVar26 * fVar162;
        fVar188 = fVar161 * fVar161 + fVar169 * fVar169 + fVar165 * fVar165;
        auVar173 = ZEXT416((uint)fVar188);
        auVar126 = rsqrtss(ZEXT416((uint)fVar188),auVar173);
        fVar26 = auVar126._0_4_;
        fVar234 = fVar26 * 1.5 - fVar26 * fVar26 * fVar188 * 0.5 * fVar26;
        fVar120 = fVar165 * fVar68 + fVar161 * fVar168 + fVar169 * fVar111;
        auVar126 = rcpss(auVar173,auVar173);
        fVar103 = (2.0 - fVar188 * auVar126._0_4_) * auVar126._0_4_;
        fVar152 = fVar124 * fVar124 + fVar119 * fVar119 + fVar112 * fVar112;
        auVar126 = ZEXT416((uint)fVar152);
        auVar173 = rsqrtss(ZEXT416((uint)fVar152),auVar126);
        fVar26 = auVar173._0_4_;
        fVar113 = fVar26 * 1.5 - fVar26 * fVar26 * fVar152 * 0.5 * fVar26;
        fVar149 = fVar112 * fVar154 + fVar124 * fVar67 + fVar119 * fVar66;
        auVar126 = rcpss(auVar126,auVar126);
        fVar26 = (2.0 - fVar152 * auVar126._0_4_) * auVar126._0_4_;
        fVar114 = fVar180 * fVar169 * fVar234;
        fVar122 = fVar180 * fVar161 * fVar234;
        fVar164 = fVar180 * fVar165 * fVar234;
        fVar227 = fVar153 - fVar114;
        fVar150 = fVar172 - fVar122;
        fVar163 = fVar228 - fVar164;
        fVar171 = fVar180 * fVar103 * (fVar188 * fVar111 - fVar120 * fVar169) * fVar234 +
                  fVar207 * fVar169 * fVar234;
        fVar168 = fVar180 * fVar103 * (fVar188 * fVar168 - fVar120 * fVar161) * fVar234 +
                  fVar207 * fVar161 * fVar234;
        fVar188 = fVar180 * fVar103 * (fVar188 * fVar68 - fVar120 * fVar165) * fVar234 +
                  fVar207 * fVar165 * fVar234;
        fVar68 = fVar170 * fVar119 * fVar113;
        fVar103 = fVar170 * fVar124 * fVar113;
        fVar111 = fVar170 * fVar112 * fVar113;
        fVar234 = fVar233 - fVar68;
        fVar161 = fVar151 - fVar103;
        fVar165 = fVar166 - fVar111;
        fVar66 = fVar170 * fVar26 * (fVar152 * fVar66 - fVar149 * fVar119) * fVar113 +
                 fVar167 * fVar119 * fVar113;
        fVar67 = fVar170 * fVar26 * (fVar152 * fVar67 - fVar149 * fVar124) * fVar113 +
                 fVar167 * fVar124 * fVar113;
        fVar154 = fVar170 * fVar26 * (fVar152 * fVar154 - fVar149 * fVar112) * fVar113 +
                  fVar167 * fVar112 * fVar113;
        fVar119 = (fVar209 - fVar171) * 0.33333334 + fVar227;
        fVar124 = (fVar197 - fVar168) * 0.33333334 + fVar150;
        fVar207 = (fVar205 - fVar188) * 0.33333334 + fVar163;
        fVar26 = fVar234 - (fVar123 - fVar66) * 0.33333334;
        fVar112 = fVar161 - (fVar235 - fVar67) * 0.33333334;
        fVar113 = fVar165 - (fVar162 - fVar154) * 0.33333334;
        lVar14 = 0;
        local_238 = _DAT_01feb9f0;
        local_248 = _DAT_01feb9f0;
        _local_278 = _DAT_01feba00;
        auVar159 = _DAT_01feba00;
        auVar126 = _DAT_01feb9f0;
        auVar232 = _DAT_01feba00;
        do {
          uVar12 = (uint)lVar14;
          lVar18 = lVar14 * 4;
          fVar152 = *(float *)(bezier_basis0 + lVar18 + 0x1dc);
          fVar149 = *(float *)(bezier_basis0 + lVar18 + 0x1e0);
          fVar169 = *(float *)(bezier_basis0 + lVar18 + 0x1e4);
          fVar120 = *(float *)(bezier_basis0 + lVar18 + 0x1e8);
          lVar18 = lVar14 * 4;
          fVar167 = *(float *)(bezier_basis0 + lVar18 + 0x660);
          fVar170 = *(float *)(bezier_basis0 + lVar18 + 0x664);
          fVar180 = *(float *)(bezier_basis0 + lVar18 + 0x668);
          fVar181 = *(float *)(bezier_basis0 + lVar18 + 0x66c);
          lVar18 = lVar14 * 4;
          fVar182 = *(float *)(bezier_basis0 + lVar18 + 0xae4);
          fVar220 = *(float *)(bezier_basis0 + lVar18 + 0xae8);
          fVar224 = *(float *)(bezier_basis0 + lVar18 + 0xaec);
          fVar225 = *(float *)(bezier_basis0 + lVar18 + 0xaf0);
          lVar18 = lVar14 * 4;
          fVar226 = *(float *)(bezier_basis0 + lVar18 + 0xf68);
          fVar236 = *(float *)(bezier_basis0 + lVar18 + 0xf6c);
          fVar10 = *(float *)(bezier_basis0 + lVar18 + 0xf70);
          fVar11 = *(float *)(bezier_basis0 + lVar18 + 0xf74);
          auVar200._0_4_ =
               fVar227 * fVar152 + fVar119 * fVar167 + fVar26 * fVar182 + fVar234 * fVar226;
          auVar200._4_4_ =
               fVar227 * fVar149 + fVar119 * fVar170 + fVar26 * fVar220 + fVar234 * fVar236;
          auVar200._8_4_ =
               fVar227 * fVar169 + fVar119 * fVar180 + fVar26 * fVar224 + fVar234 * fVar10;
          auVar200._12_4_ =
               fVar227 * fVar120 + fVar119 * fVar181 + fVar26 * fVar225 + fVar234 * fVar11;
          auVar214._0_4_ =
               fVar150 * fVar152 + fVar124 * fVar167 + fVar112 * fVar182 + fVar161 * fVar226;
          auVar214._4_4_ =
               fVar150 * fVar149 + fVar124 * fVar170 + fVar112 * fVar220 + fVar161 * fVar236;
          auVar214._8_4_ =
               fVar150 * fVar169 + fVar124 * fVar180 + fVar112 * fVar224 + fVar161 * fVar10;
          auVar214._12_4_ =
               fVar150 * fVar120 + fVar124 * fVar181 + fVar112 * fVar225 + fVar161 * fVar11;
          local_118._0_4_ =
               fVar152 * fVar163 + fVar167 * fVar207 + fVar182 * fVar113 + fVar226 * fVar165;
          local_118._4_4_ =
               fVar149 * fVar163 + fVar170 * fVar207 + fVar220 * fVar113 + fVar236 * fVar165;
          fStack_110 = fVar169 * fVar163 + fVar180 * fVar207 + fVar224 * fVar113 + fVar10 * fVar165;
          fStack_10c = fVar120 * fVar163 + fVar181 * fVar207 + fVar225 * fVar113 + fVar11 * fVar165;
          lVar18 = lVar14 * 4;
          fVar152 = *(float *)(bezier_basis0 + lVar18 + 0x13ec);
          fVar149 = *(float *)(bezier_basis0 + lVar18 + 0x13f0);
          fVar169 = *(float *)(bezier_basis0 + lVar18 + 0x13f4);
          fVar120 = *(float *)(bezier_basis0 + lVar18 + 0x13f8);
          lVar18 = lVar14 * 4;
          fVar167 = *(float *)(bezier_basis0 + lVar18 + 0x1870);
          fVar170 = *(float *)(bezier_basis0 + lVar18 + 0x1874);
          fVar180 = *(float *)(bezier_basis0 + lVar18 + 0x1878);
          fVar181 = *(float *)(bezier_basis0 + lVar18 + 0x187c);
          lVar18 = lVar14 * 4;
          fVar182 = *(float *)(bezier_basis0 + lVar18 + 0x1cf4);
          fVar220 = *(float *)(bezier_basis0 + lVar18 + 0x1cf8);
          fVar224 = *(float *)(bezier_basis0 + lVar18 + 0x1cfc);
          fVar225 = *(float *)(bezier_basis0 + lVar18 + 0x1d00);
          lVar18 = lVar14 * 4;
          fVar226 = *(float *)(bezier_basis0 + lVar18 + 0x2178);
          fVar236 = *(float *)(bezier_basis0 + lVar18 + 0x217c);
          fVar10 = *(float *)(bezier_basis0 + lVar18 + 0x2180);
          fVar11 = *(float *)(bezier_basis0 + lVar18 + 0x2184);
          fVar210 = fVar227 * fVar152 + fVar119 * fVar167 + fVar26 * fVar182 + fVar234 * fVar226;
          fVar211 = fVar227 * fVar149 + fVar119 * fVar170 + fVar26 * fVar220 + fVar234 * fVar236;
          fVar217 = fVar227 * fVar169 + fVar119 * fVar180 + fVar26 * fVar224 + fVar234 * fVar10;
          fVar218 = fVar227 * fVar120 + fVar119 * fVar181 + fVar26 * fVar225 + fVar234 * fVar11;
          fVar88 = fVar150 * fVar152 + fVar124 * fVar167 + fVar112 * fVar182 + fVar161 * fVar226;
          fVar198 = fVar150 * fVar149 + fVar124 * fVar170 + fVar112 * fVar220 + fVar161 * fVar236;
          fVar206 = fVar150 * fVar169 + fVar124 * fVar180 + fVar112 * fVar224 + fVar161 * fVar10;
          fVar208 = fVar150 * fVar120 + fVar124 * fVar181 + fVar112 * fVar225 + fVar161 * fVar11;
          fVar152 = fVar152 * fVar163 + fVar167 * fVar207 + fVar182 * fVar113 + fVar226 * fVar165;
          fVar149 = fVar149 * fVar163 + fVar170 * fVar207 + fVar220 * fVar113 + fVar236 * fVar165;
          fVar169 = fVar169 * fVar163 + fVar180 * fVar207 + fVar224 * fVar113 + fVar10 * fVar165;
          fVar120 = fVar120 * fVar163 + fVar181 * fVar207 + fVar225 * fVar113 + fVar11 * fVar165;
          uVar139 = -(uint)(uVar12 == 0);
          uVar140 = -(uint)(uVar12 == 1);
          uVar141 = -(uint)(uVar12 == 2);
          uVar146 = -(uint)(uVar12 == 3);
          uVar22 = -(uint)(uVar12 == 7);
          uVar121 = -(uint)(uVar12 == 6);
          uVar125 = -(uint)(uVar12 == 5);
          uVar138 = -(uint)(uVar12 == 4);
          auVar158._0_4_ = (float)(~uVar22 & (uint)fVar210) * 0.055555556 + auVar200._0_4_;
          auVar158._4_4_ = (float)(~uVar121 & (uint)fVar211) * 0.055555556 + auVar200._4_4_;
          auVar158._8_4_ = (float)(~uVar125 & (uint)fVar217) * 0.055555556 + auVar200._8_4_;
          auVar158._12_4_ = (float)(~uVar138 & (uint)fVar218) * 0.055555556 + auVar200._12_4_;
          auVar69 = minps(local_248,auVar200);
          auVar143 = maxps(auVar232,auVar200);
          auVar231._0_8_ =
               CONCAT44(auVar200._4_4_ - (float)(~uVar140 & (uint)fVar211) * 0.055555556,
                        auVar200._0_4_ - (float)(~uVar139 & (uint)fVar210) * 0.055555556);
          auVar231._8_4_ = auVar200._8_4_ - (float)(~uVar141 & (uint)fVar217) * 0.055555556;
          auVar231._12_4_ = auVar200._12_4_ - (float)(~uVar146 & (uint)fVar218) * 0.055555556;
          auVar201._0_4_ = (float)(~uVar22 & (uint)fVar88) * 0.055555556 + auVar214._0_4_;
          auVar201._4_4_ = (float)(~uVar121 & (uint)fVar198) * 0.055555556 + auVar214._4_4_;
          auVar201._8_4_ = (float)(~uVar125 & (uint)fVar206) * 0.055555556 + auVar214._8_4_;
          auVar201._12_4_ = (float)(~uVar138 & (uint)fVar208) * 0.055555556 + auVar214._12_4_;
          auVar104 = minps(local_238,auVar214);
          auVar128 = maxps(_local_278,auVar214);
          auVar215._0_8_ =
               CONCAT44(auVar214._4_4_ - (float)(~uVar140 & (uint)fVar198) * 0.055555556,
                        auVar214._0_4_ - (float)(~uVar139 & (uint)fVar88) * 0.055555556);
          auVar215._8_4_ = auVar214._8_4_ - (float)(~uVar141 & (uint)fVar206) * 0.055555556;
          auVar215._12_4_ = auVar214._12_4_ - (float)(~uVar146 & (uint)fVar208) * 0.055555556;
          auVar107._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar107._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar107._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar107._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar117._0_4_ = (float)(~uVar22 & (uint)fVar152) * 0.055555556 + (float)local_118._0_4_;
          auVar117._4_4_ = (float)(~uVar121 & (uint)fVar149) * 0.055555556 + (float)local_118._4_4_;
          auVar117._8_4_ = (float)(~uVar125 & (uint)fVar169) * 0.055555556 + fStack_110;
          auVar117._12_4_ = (float)(~uVar138 & (uint)fVar120) * 0.055555556 + fStack_10c;
          auVar173 = minps(auVar126,_local_118);
          auVar229 = maxps(auVar159,_local_118);
          auVar78._0_8_ =
               CONCAT44((float)local_118._4_4_ - (float)(~uVar140 & (uint)fVar149) * 0.055555556,
                        (float)local_118._0_4_ - (float)(~uVar139 & (uint)fVar152) * 0.055555556);
          auVar78._8_4_ = fStack_110 - (float)(~uVar141 & (uint)fVar169) * 0.055555556;
          auVar78._12_4_ = fStack_10c - (float)(~uVar146 & (uint)fVar120) * 0.055555556;
          auVar190._8_4_ = auVar231._8_4_;
          auVar190._0_8_ = auVar231._0_8_;
          auVar190._12_4_ = auVar231._12_4_;
          auVar212 = minps(auVar190,auVar158);
          auVar212 = minps(auVar69,auVar212);
          auVar191._8_4_ = auVar215._8_4_;
          auVar191._0_8_ = auVar215._0_8_;
          auVar191._12_4_ = auVar215._12_4_;
          auVar69 = minps(auVar191,auVar201);
          auVar69 = minps(auVar104,auVar69);
          auVar192._8_4_ = auVar78._8_4_;
          auVar192._0_8_ = auVar78._0_8_;
          auVar192._12_4_ = auVar78._12_4_;
          auVar104 = minps(auVar192,auVar117);
          auVar173 = minps(auVar173,auVar104);
          auVar186._0_4_ = local_248._0_4_ & auVar107._0_4_;
          auVar186._4_4_ = local_248._4_4_ & auVar107._4_4_;
          auVar186._8_4_ = local_248._8_4_ & auVar107._8_4_;
          auVar186._12_4_ = local_248._12_4_ & auVar107._12_4_;
          local_248 = auVar186 | ~auVar107 & auVar212;
          uVar12 = local_238._0_4_ & auVar107._0_4_ | ~auVar107._0_4_ & auVar69._0_4_;
          uVar22 = local_238._4_4_ & auVar107._4_4_ | ~auVar107._4_4_ & auVar69._4_4_;
          uVar121 = local_238._8_4_ & auVar107._8_4_ | ~auVar107._8_4_ & auVar69._8_4_;
          local_238._12_4_ = local_238._12_4_ & auVar107._12_4_ | ~auVar107._12_4_ & auVar69._12_4_;
          local_238._4_4_ = uVar22;
          local_238._0_4_ = uVar12;
          local_238._8_4_ = uVar121;
          auVar134._0_4_ = ~auVar107._0_4_ & auVar173._0_4_;
          auVar134._4_4_ = ~auVar107._4_4_ & auVar173._4_4_;
          auVar134._8_4_ = ~auVar107._8_4_ & auVar173._8_4_;
          auVar134._12_4_ = ~auVar107._12_4_ & auVar173._12_4_;
          auVar223._0_4_ = auVar126._0_4_ & auVar107._0_4_;
          auVar223._4_4_ = auVar126._4_4_ & auVar107._4_4_;
          auVar223._8_4_ = auVar126._8_4_ & auVar107._8_4_;
          auVar223._12_4_ = auVar126._12_4_ & auVar107._12_4_;
          auVar126 = auVar223 | auVar134;
          auVar173 = maxps(auVar231,auVar158);
          auVar69 = maxps(auVar143,auVar173);
          local_1c8._0_4_ = auVar232._0_4_;
          local_1c8._4_4_ = auVar232._4_4_;
          fStack_1c0 = auVar232._8_4_;
          fStack_1bc = auVar232._12_4_;
          auVar173 = maxps(auVar215,auVar201);
          auVar104 = maxps(auVar128,auVar173);
          auVar173 = maxps(auVar78,auVar117);
          auVar173 = maxps(auVar229,auVar173);
          auVar44._0_4_ = ~auVar107._0_4_ & auVar69._0_4_;
          auVar44._4_4_ = ~auVar107._4_4_ & auVar69._4_4_;
          auVar44._8_4_ = ~auVar107._8_4_ & auVar69._8_4_;
          auVar44._12_4_ = ~auVar107._12_4_ & auVar69._12_4_;
          auVar232._0_4_ = local_1c8._0_4_ & auVar107._0_4_;
          auVar232._4_4_ = local_1c8._4_4_ & auVar107._4_4_;
          auVar232._8_4_ = (uint)fStack_1c0 & auVar107._8_4_;
          auVar232._12_4_ = (uint)fStack_1bc & auVar107._12_4_;
          auVar232 = auVar232 | auVar44;
          uVar125 = local_278._0_4_ & auVar107._0_4_ | ~auVar107._0_4_ & auVar104._0_4_;
          uVar138 = local_278._4_4_ & auVar107._4_4_ | ~auVar107._4_4_ & auVar104._4_4_;
          uVar139 = local_278._8_4_ & auVar107._8_4_ | ~auVar107._8_4_ & auVar104._8_4_;
          fStack_26c = (float)(local_278._12_4_ & auVar107._12_4_ |
                              ~auVar107._12_4_ & auVar104._12_4_);
          local_278._4_4_ = uVar138;
          local_278._0_4_ = uVar125;
          fStack_270 = (float)uVar139;
          local_2b8._0_4_ = auVar159._0_4_;
          local_2b8._4_4_ = auVar159._4_4_;
          local_2b8._8_4_ = auVar159._8_4_;
          local_2b8._12_4_ = auVar159._12_4_;
          auVar45._0_4_ = local_2b8._0_4_ & auVar107._0_4_;
          auVar45._4_4_ = local_2b8._4_4_ & auVar107._4_4_;
          auVar45._8_4_ = local_2b8._8_4_ & auVar107._8_4_;
          auVar45._12_4_ = local_2b8._12_4_ & auVar107._12_4_;
          auVar159._4_4_ = ~auVar107._4_4_ & auVar173._4_4_;
          auVar159._0_4_ = ~auVar107._0_4_ & auVar173._0_4_;
          auVar159._8_4_ = ~auVar107._8_4_ & auVar173._8_4_;
          auVar159._12_4_ = ~auVar107._12_4_ & auVar173._12_4_;
          auVar159 = auVar159 | auVar45;
          lVar14 = lVar14 + 4;
        } while (lVar14 == 4);
        fVar153 = fVar153 + fVar114;
        fVar172 = fVar172 + fVar122;
        fVar228 = fVar228 + fVar164;
        fVar233 = fVar233 + fVar68;
        fVar151 = fVar151 + fVar103;
        fVar166 = fVar166 + fVar111;
        fVar68 = (fVar171 + fVar209) * 0.33333334 + fVar153;
        fVar103 = (fVar168 + fVar197) * 0.33333334 + fVar172;
        fVar111 = (fVar188 + fVar205) * 0.33333334 + fVar228;
        fVar26 = fVar233 - (fVar66 + fVar123) * 0.33333334;
        fVar66 = fVar151 - (fVar67 + fVar235) * 0.33333334;
        fVar154 = fVar166 - (fVar154 + fVar162) * 0.33333334;
        auVar46._4_4_ = local_248._0_4_;
        auVar46._0_4_ = local_248._4_4_;
        auVar46._8_4_ = local_248._12_4_;
        auVar46._12_4_ = local_248._8_4_;
        auVar173 = minps(auVar46,local_248);
        auVar79._0_8_ = auVar173._8_8_;
        auVar79._8_4_ = auVar173._0_4_;
        auVar79._12_4_ = auVar173._4_4_;
        auVar69 = minps(auVar79,auVar173);
        auVar47._4_4_ = uVar12;
        auVar47._0_4_ = uVar22;
        auVar47._8_4_ = local_238._12_4_;
        auVar47._12_4_ = uVar121;
        auVar173 = minps(auVar47,local_238);
        auVar95._0_8_ = auVar173._8_8_;
        auVar95._8_4_ = auVar173._0_4_;
        auVar95._12_4_ = auVar173._4_4_;
        auVar173 = minps(auVar95,auVar173);
        auVar48._4_4_ = auVar126._0_4_;
        auVar48._0_4_ = auVar126._4_4_;
        auVar48._8_4_ = auVar126._12_4_;
        auVar48._12_4_ = auVar126._8_4_;
        auVar126 = minps(auVar48,auVar126);
        auVar49._0_8_ = auVar126._8_8_;
        auVar49._8_4_ = auVar126._0_4_;
        auVar49._12_4_ = auVar126._4_4_;
        auVar109._4_4_ = auVar173._0_4_;
        auVar109._0_4_ = auVar69._0_4_;
        auVar50._4_4_ = auVar232._0_4_;
        auVar50._0_4_ = auVar232._4_4_;
        auVar50._8_4_ = auVar232._12_4_;
        auVar50._12_4_ = auVar232._8_4_;
        auVar173 = maxps(auVar50,auVar232);
        auVar80._0_8_ = auVar173._8_8_;
        auVar80._8_4_ = auVar173._0_4_;
        auVar80._12_4_ = auVar173._4_4_;
        auVar69 = maxps(auVar80,auVar173);
        auVar51._4_4_ = uVar125;
        auVar51._0_4_ = uVar138;
        auVar51._8_4_ = fStack_26c;
        auVar51._12_4_ = uVar139;
        auVar173 = maxps(auVar51,_local_278);
        auVar96._0_8_ = auVar173._8_8_;
        auVar96._8_4_ = auVar173._0_4_;
        auVar96._12_4_ = auVar173._4_4_;
        auVar104 = maxps(auVar96,auVar173);
        auVar52._4_4_ = auVar159._0_4_;
        auVar52._0_4_ = auVar159._4_4_;
        auVar52._8_4_ = auVar159._12_4_;
        auVar52._12_4_ = auVar159._8_4_;
        auVar173 = maxps(auVar52,auVar159);
        auVar53._0_8_ = auVar173._8_8_;
        auVar53._8_4_ = auVar173._0_4_;
        auVar53._12_4_ = auVar173._4_4_;
        auVar118._4_4_ = auVar104._0_4_;
        auVar118._0_4_ = auVar69._0_4_;
        lVar14 = 0;
        local_288._8_8_ = 0x7f8000007f800000;
        local_288._0_8_ = 0x7f8000007f800000;
        local_298._8_8_ = 0x7f8000007f800000;
        local_298._0_8_ = 0x7f8000007f800000;
        local_2a8._8_8_ = 0x7f8000007f800000;
        local_2a8._0_8_ = 0x7f8000007f800000;
        local_238 = _DAT_01feba00;
        local_248 = _DAT_01feba00;
        auVar137 = _DAT_01feba00;
        do {
          uVar12 = (uint)lVar14;
          lVar18 = lVar14 * 4;
          fVar67 = *(float *)(bezier_basis0 + lVar18 + 0x1dc);
          fVar112 = *(float *)(bezier_basis0 + lVar18 + 0x1e0);
          fVar113 = *(float *)(bezier_basis0 + lVar18 + 0x1e4);
          fVar114 = *(float *)(bezier_basis0 + lVar18 + 0x1e8);
          lVar18 = lVar14 * 4;
          fVar119 = *(float *)(bezier_basis0 + lVar18 + 0x660);
          fVar122 = *(float *)(bezier_basis0 + lVar18 + 0x664);
          fVar124 = *(float *)(bezier_basis0 + lVar18 + 0x668);
          fVar209 = *(float *)(bezier_basis0 + lVar18 + 0x66c);
          lVar18 = lVar14 * 4;
          fVar197 = *(float *)(bezier_basis0 + lVar18 + 0xae4);
          fVar205 = *(float *)(bezier_basis0 + lVar18 + 0xae8);
          fVar207 = *(float *)(bezier_basis0 + lVar18 + 0xaec);
          fVar164 = *(float *)(bezier_basis0 + lVar18 + 0xaf0);
          lVar18 = lVar14 * 4;
          fVar168 = *(float *)(bezier_basis0 + lVar18 + 0xf68);
          fVar152 = *(float *)(bezier_basis0 + lVar18 + 0xf6c);
          fVar171 = *(float *)(bezier_basis0 + lVar18 + 0xf70);
          fVar188 = *(float *)(bezier_basis0 + lVar18 + 0xf74);
          auVar54._0_4_ = fVar153 * fVar67 + fVar68 * fVar119 + fVar26 * fVar197 + fVar233 * fVar168
          ;
          auVar54._4_4_ =
               fVar153 * fVar112 + fVar68 * fVar122 + fVar26 * fVar205 + fVar233 * fVar152;
          auVar54._8_4_ =
               fVar153 * fVar113 + fVar68 * fVar124 + fVar26 * fVar207 + fVar233 * fVar171;
          auVar54._12_4_ =
               fVar153 * fVar114 + fVar68 * fVar209 + fVar26 * fVar164 + fVar233 * fVar188;
          auVar135._0_4_ =
               fVar172 * fVar67 + fVar103 * fVar119 + fVar66 * fVar197 + fVar151 * fVar168;
          auVar135._4_4_ =
               fVar172 * fVar112 + fVar103 * fVar122 + fVar66 * fVar205 + fVar151 * fVar152;
          auVar135._8_4_ =
               fVar172 * fVar113 + fVar103 * fVar124 + fVar66 * fVar207 + fVar151 * fVar171;
          auVar135._12_4_ =
               fVar172 * fVar114 + fVar103 * fVar209 + fVar66 * fVar164 + fVar151 * fVar188;
          local_208._0_4_ =
               fVar67 * fVar228 + fVar119 * fVar111 + fVar197 * fVar154 + fVar168 * fVar166;
          local_208._4_4_ =
               fVar112 * fVar228 + fVar122 * fVar111 + fVar205 * fVar154 + fVar152 * fVar166;
          fStack_200 = fVar113 * fVar228 + fVar124 * fVar111 + fVar207 * fVar154 + fVar171 * fVar166
          ;
          fStack_1fc = fVar114 * fVar228 + fVar209 * fVar111 + fVar164 * fVar154 + fVar188 * fVar166
          ;
          lVar18 = lVar14 * 4;
          fVar67 = *(float *)(bezier_basis0 + lVar18 + 0x13ec);
          fVar112 = *(float *)(bezier_basis0 + lVar18 + 0x13f0);
          fVar113 = *(float *)(bezier_basis0 + lVar18 + 0x13f4);
          fVar114 = *(float *)(bezier_basis0 + lVar18 + 0x13f8);
          lVar18 = lVar14 * 4;
          fVar119 = *(float *)(bezier_basis0 + lVar18 + 0x1870);
          fVar122 = *(float *)(bezier_basis0 + lVar18 + 0x1874);
          fVar124 = *(float *)(bezier_basis0 + lVar18 + 0x1878);
          fVar209 = *(float *)(bezier_basis0 + lVar18 + 0x187c);
          lVar18 = lVar14 * 4;
          fVar197 = *(float *)(bezier_basis0 + lVar18 + 0x1cf4);
          fVar205 = *(float *)(bezier_basis0 + lVar18 + 0x1cf8);
          fVar207 = *(float *)(bezier_basis0 + lVar18 + 0x1cfc);
          fVar164 = *(float *)(bezier_basis0 + lVar18 + 0x1d00);
          lVar18 = lVar14 * 4;
          fVar168 = *(float *)(bezier_basis0 + lVar18 + 0x2178);
          fVar152 = *(float *)(bezier_basis0 + lVar18 + 0x217c);
          fVar171 = *(float *)(bezier_basis0 + lVar18 + 0x2180);
          fVar188 = *(float *)(bezier_basis0 + lVar18 + 0x2184);
          fVar234 = fVar153 * fVar67 + fVar68 * fVar119 + fVar26 * fVar197 + fVar233 * fVar168;
          fVar149 = fVar153 * fVar112 + fVar68 * fVar122 + fVar26 * fVar205 + fVar233 * fVar152;
          fVar161 = fVar153 * fVar113 + fVar68 * fVar124 + fVar26 * fVar207 + fVar233 * fVar171;
          fVar165 = fVar153 * fVar114 + fVar68 * fVar209 + fVar26 * fVar164 + fVar233 * fVar188;
          fVar169 = fVar172 * fVar67 + fVar103 * fVar119 + fVar66 * fVar197 + fVar151 * fVar168;
          fVar120 = fVar172 * fVar112 + fVar103 * fVar122 + fVar66 * fVar205 + fVar151 * fVar152;
          fVar123 = fVar172 * fVar113 + fVar103 * fVar124 + fVar66 * fVar207 + fVar151 * fVar171;
          fVar227 = fVar172 * fVar114 + fVar103 * fVar209 + fVar66 * fVar164 + fVar151 * fVar188;
          fVar67 = fVar67 * fVar228 + fVar119 * fVar111 + fVar197 * fVar154 + fVar168 * fVar166;
          fVar112 = fVar112 * fVar228 + fVar122 * fVar111 + fVar205 * fVar154 + fVar152 * fVar166;
          fVar113 = fVar113 * fVar228 + fVar124 * fVar111 + fVar207 * fVar154 + fVar171 * fVar166;
          fVar114 = fVar114 * fVar228 + fVar209 * fVar111 + fVar164 * fVar154 + fVar188 * fVar166;
          uVar22 = -(uint)(uVar12 == 0);
          uVar121 = -(uint)(uVar12 == 1);
          uVar125 = -(uint)(uVar12 == 2);
          uVar138 = -(uint)(uVar12 == 3);
          uVar139 = -(uint)(uVar12 == 7);
          uVar140 = -(uint)(uVar12 == 6);
          uVar141 = -(uint)(uVar12 == 5);
          uVar146 = -(uint)(uVar12 == 4);
          local_278._4_4_ = (float)(~uVar140 & (uint)fVar149) * 0.055555556 + auVar54._4_4_;
          local_278._0_4_ = (float)(~uVar139 & (uint)fVar234) * 0.055555556 + auVar54._0_4_;
          fStack_270 = (float)(~uVar141 & (uint)fVar161) * 0.055555556 + auVar54._8_4_;
          fStack_26c = (float)(~uVar146 & (uint)fVar165) * 0.055555556 + auVar54._12_4_;
          auVar104 = minps(local_2a8,auVar54);
          auVar128 = maxps(local_248,auVar54);
          auVar160._0_8_ =
               CONCAT44(auVar54._4_4_ - (float)(~uVar121 & (uint)fVar149) * 0.055555556,
                        auVar54._0_4_ - (float)(~uVar22 & (uint)fVar234) * 0.055555556);
          auVar160._8_4_ = auVar54._8_4_ - (float)(~uVar125 & (uint)fVar161) * 0.055555556;
          auVar160._12_4_ = auVar54._12_4_ - (float)(~uVar138 & (uint)fVar165) * 0.055555556;
          auVar193._0_4_ = (float)(~uVar139 & (uint)fVar169) * 0.055555556 + auVar135._0_4_;
          auVar193._4_4_ = (float)(~uVar140 & (uint)fVar120) * 0.055555556 + auVar135._4_4_;
          auVar193._8_4_ = (float)(~uVar141 & (uint)fVar123) * 0.055555556 + auVar135._8_4_;
          auVar193._12_4_ = (float)(~uVar146 & (uint)fVar227) * 0.055555556 + auVar135._12_4_;
          auVar229 = minps(local_298,auVar135);
          auVar222 = maxps(local_238,auVar135);
          auVar136._0_8_ =
               CONCAT44(auVar135._4_4_ - (float)(~uVar121 & (uint)fVar120) * 0.055555556,
                        auVar135._0_4_ - (float)(~uVar22 & (uint)fVar169) * 0.055555556);
          auVar136._8_4_ = auVar135._8_4_ - (float)(~uVar125 & (uint)fVar123) * 0.055555556;
          auVar136._12_4_ = auVar135._12_4_ - (float)(~uVar138 & (uint)fVar227) * 0.055555556;
          auVar145._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar145._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar145._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar145._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar12 ^ 0x80000000));
          auVar216._0_4_ = (float)(~uVar139 & (uint)fVar67) * 0.055555556 + (float)local_208._0_4_;
          auVar216._4_4_ = (float)(~uVar140 & (uint)fVar112) * 0.055555556 + (float)local_208._4_4_;
          auVar216._8_4_ = (float)(~uVar141 & (uint)fVar113) * 0.055555556 + fStack_200;
          auVar216._12_4_ = (float)(~uVar146 & (uint)fVar114) * 0.055555556 + fStack_1fc;
          auVar69 = minps(local_288,_local_208);
          auVar212 = maxps(auVar137,_local_208);
          auVar97._0_8_ =
               CONCAT44((float)local_208._4_4_ - (float)(~uVar121 & (uint)fVar112) * 0.055555556,
                        (float)local_208._0_4_ - (float)(~uVar22 & (uint)fVar67) * 0.055555556);
          auVar97._8_4_ = fStack_200 - (float)(~uVar125 & (uint)fVar113) * 0.055555556;
          auVar97._12_4_ = fStack_1fc - (float)(~uVar138 & (uint)fVar114) * 0.055555556;
          auVar202._8_4_ = auVar160._8_4_;
          auVar202._0_8_ = auVar160._0_8_;
          auVar202._12_4_ = auVar160._12_4_;
          auVar143 = minps(auVar202,_local_278);
          auVar104 = minps(auVar104,auVar143);
          auVar203._8_4_ = auVar136._8_4_;
          auVar203._0_8_ = auVar136._0_8_;
          auVar203._12_4_ = auVar136._12_4_;
          auVar143 = minps(auVar203,auVar193);
          auVar229 = minps(auVar229,auVar143);
          auVar204._8_4_ = auVar97._8_4_;
          auVar204._0_8_ = auVar97._0_8_;
          auVar204._12_4_ = auVar97._12_4_;
          auVar143 = minps(auVar204,auVar216);
          auVar69 = minps(auVar69,auVar143);
          auVar179._0_4_ = local_2a8._0_4_ & auVar145._0_4_;
          auVar179._4_4_ = local_2a8._4_4_ & auVar145._4_4_;
          auVar179._8_4_ = local_2a8._8_4_ & auVar145._8_4_;
          auVar179._12_4_ = local_2a8._12_4_ & auVar145._12_4_;
          local_2a8 = auVar179 | ~auVar145 & auVar104;
          uVar12 = local_298._0_4_ & auVar145._0_4_ | ~auVar145._0_4_ & auVar229._0_4_;
          uVar22 = local_298._4_4_ & auVar145._4_4_ | ~auVar145._4_4_ & auVar229._4_4_;
          uVar121 = local_298._8_4_ & auVar145._8_4_ | ~auVar145._8_4_ & auVar229._8_4_;
          local_298._12_4_ = local_298._12_4_ & auVar145._12_4_ | ~auVar145._12_4_ & auVar229._12_4_
          ;
          local_298._4_4_ = uVar22;
          local_298._0_4_ = uVar12;
          local_298._8_4_ = uVar121;
          auVar108._0_4_ = ~auVar145._0_4_ & auVar69._0_4_;
          auVar108._4_4_ = ~auVar145._4_4_ & auVar69._4_4_;
          auVar108._8_4_ = ~auVar145._8_4_ & auVar69._8_4_;
          auVar108._12_4_ = ~auVar145._12_4_ & auVar69._12_4_;
          auVar196._0_4_ = local_288._0_4_ & auVar145._0_4_;
          auVar196._4_4_ = local_288._4_4_ & auVar145._4_4_;
          auVar196._8_4_ = local_288._8_4_ & auVar145._8_4_;
          auVar196._12_4_ = local_288._12_4_ & auVar145._12_4_;
          local_288 = auVar196 | auVar108;
          auVar69 = maxps(auVar160,_local_278);
          auVar104 = maxps(auVar128,auVar69);
          auVar69 = maxps(auVar136,auVar193);
          auVar128 = maxps(auVar222,auVar69);
          auVar69 = maxps(auVar97,auVar216);
          auVar69 = maxps(auVar212,auVar69);
          uVar125 = local_248._0_4_ & auVar145._0_4_ | ~auVar145._0_4_ & auVar104._0_4_;
          uVar138 = local_248._4_4_ & auVar145._4_4_ | ~auVar145._4_4_ & auVar104._4_4_;
          uVar139 = local_248._8_4_ & auVar145._8_4_ | ~auVar145._8_4_ & auVar104._8_4_;
          local_248._12_4_ = local_248._12_4_ & auVar145._12_4_ | ~auVar145._12_4_ & auVar104._12_4_
          ;
          local_248._4_4_ = uVar138;
          local_248._0_4_ = uVar125;
          local_248._8_4_ = uVar139;
          auVar55._0_4_ = ~auVar145._0_4_ & auVar128._0_4_;
          auVar55._4_4_ = ~auVar145._4_4_ & auVar128._4_4_;
          auVar55._8_4_ = ~auVar145._8_4_ & auVar128._8_4_;
          auVar55._12_4_ = ~auVar145._12_4_ & auVar128._12_4_;
          auVar187._0_4_ = local_238._0_4_ & auVar145._0_4_;
          auVar187._4_4_ = local_238._4_4_ & auVar145._4_4_;
          auVar187._8_4_ = local_238._8_4_ & auVar145._8_4_;
          auVar187._12_4_ = local_238._12_4_ & auVar145._12_4_;
          local_238 = auVar187 | auVar55;
          local_2b8._0_4_ = auVar137._0_4_;
          local_2b8._4_4_ = auVar137._4_4_;
          local_2b8._8_4_ = auVar137._8_4_;
          local_2b8._12_4_ = auVar137._12_4_;
          auVar56._0_4_ = local_2b8._0_4_ & auVar145._0_4_;
          auVar56._4_4_ = local_2b8._4_4_ & auVar145._4_4_;
          auVar56._8_4_ = local_2b8._8_4_ & auVar145._8_4_;
          auVar56._12_4_ = local_2b8._12_4_ & auVar145._12_4_;
          auVar137._4_4_ = ~auVar145._4_4_ & auVar69._4_4_;
          auVar137._0_4_ = ~auVar145._0_4_ & auVar69._0_4_;
          auVar137._8_4_ = ~auVar145._8_4_ & auVar69._8_4_;
          auVar137._12_4_ = ~auVar145._12_4_ & auVar69._12_4_;
          auVar137 = auVar137 | auVar56;
          lVar14 = lVar14 + 4;
        } while (lVar14 == 4);
        auVar126 = minps(auVar49,auVar126);
        auVar109._8_4_ = auVar126._0_4_;
        auVar109._12_4_ = 0;
        auVar126 = maxps(auVar53,auVar173);
        auVar118._8_4_ = auVar126._0_4_;
        auVar118._12_4_ = 0;
        auVar57._4_4_ = local_2a8._0_4_;
        auVar57._0_4_ = local_2a8._4_4_;
        auVar57._8_4_ = local_2a8._12_4_;
        auVar57._12_4_ = local_2a8._8_4_;
        auVar126 = minps(auVar57,local_2a8);
        auVar81._0_8_ = auVar126._8_8_;
        auVar81._8_4_ = auVar126._0_4_;
        auVar81._12_4_ = auVar126._4_4_;
        auVar173 = minps(auVar81,auVar126);
        auVar58._4_4_ = uVar12;
        auVar58._0_4_ = uVar22;
        auVar58._8_4_ = local_298._12_4_;
        auVar58._12_4_ = uVar121;
        auVar126 = minps(auVar58,local_298);
        auVar98._0_8_ = auVar126._8_8_;
        auVar98._8_4_ = auVar126._0_4_;
        auVar98._12_4_ = auVar126._4_4_;
        auVar69 = minps(auVar98,auVar126);
        auVar59._4_4_ = local_288._0_4_;
        auVar59._0_4_ = local_288._4_4_;
        auVar59._8_4_ = local_288._12_4_;
        auVar59._12_4_ = local_288._8_4_;
        auVar126 = minps(auVar59,local_288);
        auVar82._0_8_ = auVar126._8_8_;
        auVar82._8_4_ = auVar126._0_4_;
        auVar82._12_4_ = auVar126._4_4_;
        auVar126 = minps(auVar82,auVar126);
        auVar99._4_4_ = auVar69._0_4_;
        auVar99._0_4_ = auVar173._0_4_;
        auVar99._8_4_ = auVar126._0_4_;
        auVar99._12_4_ = 0;
        auVar104 = minps(auVar109,auVar99);
        auVar60._4_4_ = uVar125;
        auVar60._0_4_ = uVar138;
        auVar60._8_4_ = local_248._12_4_;
        auVar60._12_4_ = uVar139;
        auVar126 = maxps(auVar60,local_248);
        auVar83._0_8_ = auVar126._8_8_;
        auVar83._8_4_ = auVar126._0_4_;
        auVar83._12_4_ = auVar126._4_4_;
        auVar173 = maxps(auVar83,auVar126);
        auVar61._4_4_ = local_238._0_4_;
        auVar61._0_4_ = local_238._4_4_;
        auVar61._8_4_ = local_238._12_4_;
        auVar61._12_4_ = local_238._8_4_;
        auVar126 = maxps(auVar61,local_238);
        auVar100._0_8_ = auVar126._8_8_;
        auVar100._8_4_ = auVar126._0_4_;
        auVar100._12_4_ = auVar126._4_4_;
        auVar69 = maxps(auVar100,auVar126);
        auVar62._4_4_ = auVar137._0_4_;
        auVar62._0_4_ = auVar137._4_4_;
        auVar62._8_4_ = auVar137._12_4_;
        auVar62._12_4_ = auVar137._8_4_;
        auVar126 = maxps(auVar62,auVar137);
        auVar84._0_8_ = auVar126._8_8_;
        auVar84._8_4_ = auVar126._0_4_;
        auVar84._12_4_ = auVar126._4_4_;
        auVar126 = maxps(auVar84,auVar126);
        auVar101._4_4_ = auVar69._0_4_;
        auVar101._0_4_ = auVar173._0_4_;
        auVar101._8_4_ = auVar126._0_4_;
        auVar101._12_4_ = 0;
        auVar173 = maxps(auVar118,auVar101);
        auVar63._0_8_ = auVar104._0_8_ & 0x7fffffff7fffffff;
        auVar63._8_4_ = ABS(auVar104._8_4_);
        auVar63._12_4_ = auVar104._12_4_ & 0x7fffffff;
        auVar85._0_8_ = auVar173._0_8_ & 0x7fffffff7fffffff;
        auVar85._8_4_ = ABS(auVar173._8_4_);
        auVar85._12_4_ = auVar173._12_4_ & 0x7fffffff;
        auVar126 = maxps(auVar63,auVar85);
        fVar154 = auVar126._4_4_;
        if (auVar126._4_4_ <= auVar126._0_4_) {
          fVar154 = auVar126._0_4_;
        }
        auVar64._8_8_ = auVar126._8_8_;
        auVar64._0_8_ = auVar126._8_8_;
        if (auVar126._8_4_ <= fVar154) {
          auVar64._0_4_ = fVar154;
        }
        fVar154 = auVar64._0_4_ * 4.7683716e-07;
        aVar110._0_4_ = auVar104._0_4_ - fVar154;
        aVar110._4_4_ = auVar104._4_4_ - fVar154;
        aVar110._8_4_ = auVar104._8_4_ - fVar154;
        aVar65._0_4_ = fVar154 + auVar173._0_4_;
        aVar65._4_4_ = fVar154 + auVar173._4_4_;
        aVar65._8_4_ = fVar154 + auVar173._8_4_;
        aVar110.m128[3] = (float)geomID;
        aVar65.m128[3] = (float)uVar20;
        auVar86._0_4_ = aVar110._0_4_ + aVar65._0_4_;
        auVar86._4_4_ = aVar110._4_4_ + aVar65._4_4_;
        auVar86._8_4_ = aVar110._8_4_ + aVar65._8_4_;
        auVar86._12_4_ = (float)geomID + (float)uVar20;
        local_b8 = minps(local_b8,auVar86);
        local_a8 = maxps(local_a8,auVar86);
        auVar87 = minps(auVar87,(undefined1  [16])aVar110);
        prims[local_c8].lower.field_0 = aVar110;
        auVar102 = maxps(auVar102,(undefined1  [16])aVar65);
        prims[local_c8].upper.field_0 = aVar65;
        local_e0 = local_e0 + 1;
        local_c8 = local_c8 + 1;
      }
LAB_00a6ae68:
      uVar20 = uVar20 + 1;
    } while (uVar20 < r->_end);
  }
  else {
    local_a8 = auVar102;
    local_b8 = auVar87;
  }
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar87;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar102;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_b8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_a8._8_8_;
  __return_storage_ptr__->end = local_e0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }